

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersector1<4>::
     intersect_h<embree::avx::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  long lVar72;
  uint uVar73;
  ulong uVar74;
  bool bVar75;
  float fVar76;
  float fVar103;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  float fVar105;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar106;
  float fVar142;
  float fVar145;
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar147;
  undefined1 auVar110 [16];
  float fVar107;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar148;
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar123 [32];
  float fVar143;
  float fVar149;
  undefined1 auVar124 [32];
  float fVar144;
  float fVar146;
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vint4 ai;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar188;
  float fVar189;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [28];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar184 [32];
  float fVar193;
  float fVar194;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar195;
  float fVar212;
  float fVar213;
  vint4 bi;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar217;
  float fVar219;
  undefined1 auVar207 [28];
  float fVar214;
  float fVar218;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar210 [32];
  float fVar215;
  float fVar216;
  undefined1 auVar211 [64];
  float fVar220;
  float fVar221;
  float fVar240;
  float fVar242;
  vint4 ai_2;
  undefined1 auVar222 [16];
  float fVar244;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar229 [32];
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar249;
  float fVar263;
  float fVar265;
  undefined1 auVar251 [16];
  float fVar268;
  undefined1 auVar252 [16];
  float fVar250;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar264;
  float fVar266;
  float fVar269;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar267;
  float fVar270;
  float fVar272;
  float fVar274;
  float fVar276;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar271;
  float fVar273;
  float fVar275;
  undefined1 auVar262 [64];
  float fVar277;
  float fVar286;
  float fVar287;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  float fVar288;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar285 [64];
  vint4 ai_1;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [28];
  undefined1 auVar299 [32];
  float fVar301;
  undefined1 auVar300 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar308;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [64];
  float fVar309;
  float fVar310;
  float fVar315;
  float fVar317;
  undefined1 auVar311 [16];
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar312 [32];
  float fVar316;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar324;
  float fVar328;
  float fVar330;
  undefined1 auVar326 [16];
  float fVar325;
  float fVar329;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar327 [32];
  float fVar341;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar351;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar352 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_ae4;
  undefined1 local_ae0 [32];
  ulong local_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [32];
  ulong local_a48;
  undefined1 local_a40 [16];
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 auStack_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined8 local_910;
  float local_908;
  float local_904;
  undefined4 local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  uint local_8f0;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar7 = prim[1];
  uVar70 = (ulong)(byte)PVar7;
  fVar220 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar115 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar278._0_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar278._4_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar278._8_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar278._12_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar157._0_4_ = fVar220 * auVar115._0_4_;
  auVar157._4_4_ = fVar220 * auVar115._4_4_;
  auVar157._8_4_ = fVar220 * auVar115._8_4_;
  auVar157._12_4_ = fVar220 * auVar115._12_4_;
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xb + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar70 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar74 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + uVar70 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  uVar74 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar77 = vshufps_avx(auVar278,auVar278,0);
  auVar108 = vshufps_avx(auVar278,auVar278,0x55);
  auVar158 = vshufps_avx(auVar278,auVar278,0xaa);
  fVar220 = auVar158._0_4_;
  fVar174 = auVar158._4_4_;
  fVar240 = auVar158._8_4_;
  fVar188 = auVar158._12_4_;
  fVar249 = auVar108._0_4_;
  fVar263 = auVar108._4_4_;
  fVar265 = auVar108._8_4_;
  fVar268 = auVar108._12_4_;
  fVar242 = auVar77._0_4_;
  fVar189 = auVar77._4_4_;
  fVar244 = auVar77._8_4_;
  fVar190 = auVar77._12_4_;
  auVar311._0_4_ = fVar242 * auVar115._0_4_ + fVar249 * auVar83._0_4_ + fVar220 * auVar88._0_4_;
  auVar311._4_4_ = fVar189 * auVar115._4_4_ + fVar263 * auVar83._4_4_ + fVar174 * auVar88._4_4_;
  auVar311._8_4_ = fVar244 * auVar115._8_4_ + fVar265 * auVar83._8_4_ + fVar240 * auVar88._8_4_;
  auVar311._12_4_ = fVar190 * auVar115._12_4_ + fVar268 * auVar83._12_4_ + fVar188 * auVar88._12_4_;
  auVar326._0_4_ = fVar242 * auVar114._0_4_ + fVar249 * auVar12._0_4_ + auVar13._0_4_ * fVar220;
  auVar326._4_4_ = fVar189 * auVar114._4_4_ + fVar263 * auVar12._4_4_ + auVar13._4_4_ * fVar174;
  auVar326._8_4_ = fVar244 * auVar114._8_4_ + fVar265 * auVar12._8_4_ + auVar13._8_4_ * fVar240;
  auVar326._12_4_ = fVar190 * auVar114._12_4_ + fVar268 * auVar12._12_4_ + auVar13._12_4_ * fVar188;
  auVar279._0_4_ = fVar242 * auVar78._0_4_ + fVar249 * auVar79._0_4_ + auVar109._0_4_ * fVar220;
  auVar279._4_4_ = fVar189 * auVar78._4_4_ + fVar263 * auVar79._4_4_ + auVar109._4_4_ * fVar174;
  auVar279._8_4_ = fVar244 * auVar78._8_4_ + fVar265 * auVar79._8_4_ + auVar109._8_4_ * fVar240;
  auVar279._12_4_ = fVar190 * auVar78._12_4_ + fVar268 * auVar79._12_4_ + auVar109._12_4_ * fVar188;
  auVar77 = vshufps_avx(auVar157,auVar157,0);
  auVar307 = ZEXT1664(auVar77);
  auVar108 = vshufps_avx(auVar157,auVar157,0x55);
  auVar158 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar220 = auVar158._0_4_;
  fVar174 = auVar158._4_4_;
  fVar240 = auVar158._8_4_;
  fVar188 = auVar158._12_4_;
  fVar249 = auVar108._0_4_;
  fVar263 = auVar108._4_4_;
  fVar265 = auVar108._8_4_;
  fVar268 = auVar108._12_4_;
  fVar242 = auVar77._0_4_;
  fVar189 = auVar77._4_4_;
  fVar244 = auVar77._8_4_;
  fVar190 = auVar77._12_4_;
  auVar196._0_4_ = fVar242 * auVar115._0_4_ + fVar249 * auVar83._0_4_ + fVar220 * auVar88._0_4_;
  auVar196._4_4_ = fVar189 * auVar115._4_4_ + fVar263 * auVar83._4_4_ + fVar174 * auVar88._4_4_;
  auVar196._8_4_ = fVar244 * auVar115._8_4_ + fVar265 * auVar83._8_4_ + fVar240 * auVar88._8_4_;
  auVar196._12_4_ = fVar190 * auVar115._12_4_ + fVar268 * auVar83._12_4_ + fVar188 * auVar88._12_4_;
  auVar108._0_4_ = fVar242 * auVar114._0_4_ + auVar13._0_4_ * fVar220 + fVar249 * auVar12._0_4_;
  auVar108._4_4_ = fVar189 * auVar114._4_4_ + auVar13._4_4_ * fVar174 + fVar263 * auVar12._4_4_;
  auVar108._8_4_ = fVar244 * auVar114._8_4_ + auVar13._8_4_ * fVar240 + fVar265 * auVar12._8_4_;
  auVar108._12_4_ = fVar190 * auVar114._12_4_ + auVar13._12_4_ * fVar188 + fVar268 * auVar12._12_4_;
  auVar77._0_4_ = fVar242 * auVar78._0_4_ + fVar249 * auVar79._0_4_ + auVar109._0_4_ * fVar220;
  auVar77._4_4_ = fVar189 * auVar78._4_4_ + fVar263 * auVar79._4_4_ + auVar109._4_4_ * fVar174;
  auVar77._8_4_ = fVar244 * auVar78._8_4_ + fVar265 * auVar79._8_4_ + auVar109._8_4_ * fVar240;
  auVar77._12_4_ = fVar190 * auVar78._12_4_ + fVar268 * auVar79._12_4_ + auVar109._12_4_ * fVar188;
  auVar251._8_4_ = 0x7fffffff;
  auVar251._0_8_ = 0x7fffffff7fffffff;
  auVar251._12_4_ = 0x7fffffff;
  auVar115 = vandps_avx(auVar311,auVar251);
  auVar175._8_4_ = 0x219392ef;
  auVar175._0_8_ = 0x219392ef219392ef;
  auVar175._12_4_ = 0x219392ef;
  auVar115 = vcmpps_avx(auVar115,auVar175,1);
  auVar83 = vblendvps_avx(auVar311,auVar175,auVar115);
  auVar115 = vandps_avx(auVar326,auVar251);
  auVar115 = vcmpps_avx(auVar115,auVar175,1);
  auVar88 = vblendvps_avx(auVar326,auVar175,auVar115);
  auVar115 = vandps_avx(auVar279,auVar251);
  auVar115 = vcmpps_avx(auVar115,auVar175,1);
  auVar115 = vblendvps_avx(auVar279,auVar175,auVar115);
  auVar114 = vrcpps_avx(auVar83);
  fVar249 = auVar114._0_4_;
  auVar158._0_4_ = fVar249 * auVar83._0_4_;
  fVar263 = auVar114._4_4_;
  auVar158._4_4_ = fVar263 * auVar83._4_4_;
  fVar265 = auVar114._8_4_;
  auVar158._8_4_ = fVar265 * auVar83._8_4_;
  fVar268 = auVar114._12_4_;
  auVar158._12_4_ = fVar268 * auVar83._12_4_;
  auVar280._8_4_ = 0x3f800000;
  auVar280._0_8_ = &DAT_3f8000003f800000;
  auVar280._12_4_ = 0x3f800000;
  auVar83 = vsubps_avx(auVar280,auVar158);
  fVar249 = fVar249 + fVar249 * auVar83._0_4_;
  fVar263 = fVar263 + fVar263 * auVar83._4_4_;
  fVar265 = fVar265 + fVar265 * auVar83._8_4_;
  fVar268 = fVar268 + fVar268 * auVar83._12_4_;
  auVar83 = vrcpps_avx(auVar88);
  fVar220 = auVar83._0_4_;
  auVar222._0_4_ = fVar220 * auVar88._0_4_;
  fVar240 = auVar83._4_4_;
  auVar222._4_4_ = fVar240 * auVar88._4_4_;
  fVar242 = auVar83._8_4_;
  auVar222._8_4_ = fVar242 * auVar88._8_4_;
  fVar244 = auVar83._12_4_;
  auVar222._12_4_ = fVar244 * auVar88._12_4_;
  auVar83 = vsubps_avx(auVar280,auVar222);
  fVar220 = fVar220 + fVar220 * auVar83._0_4_;
  fVar240 = fVar240 + fVar240 * auVar83._4_4_;
  fVar242 = fVar242 + fVar242 * auVar83._8_4_;
  fVar244 = fVar244 + fVar244 * auVar83._12_4_;
  auVar83 = vrcpps_avx(auVar115);
  fVar174 = auVar83._0_4_;
  auVar176._0_4_ = fVar174 * auVar115._0_4_;
  fVar188 = auVar83._4_4_;
  auVar176._4_4_ = fVar188 * auVar115._4_4_;
  fVar189 = auVar83._8_4_;
  auVar176._8_4_ = fVar189 * auVar115._8_4_;
  fVar190 = auVar83._12_4_;
  auVar176._12_4_ = fVar190 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar280,auVar176);
  fVar174 = fVar174 + fVar174 * auVar115._0_4_;
  fVar188 = fVar188 + fVar188 * auVar115._4_4_;
  fVar189 = fVar189 + fVar189 * auVar115._8_4_;
  fVar190 = fVar190 + fVar190 * auVar115._12_4_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar115 = vpmovsxwd_avx(auVar115);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar196);
  auVar159._0_4_ = fVar249 * auVar115._0_4_;
  auVar159._4_4_ = fVar263 * auVar115._4_4_;
  auVar159._8_4_ = fVar265 * auVar115._8_4_;
  auVar159._12_4_ = fVar268 * auVar115._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar115 = vpmovsxwd_avx(auVar83);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar196);
  auVar197._0_4_ = fVar249 * auVar115._0_4_;
  auVar197._4_4_ = fVar263 * auVar115._4_4_;
  auVar197._8_4_ = fVar265 * auVar115._8_4_;
  auVar197._12_4_ = fVar268 * auVar115._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar83 = vpmovsxwd_avx(auVar88);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar70 * -2 + 6);
  auVar115 = vpmovsxwd_avx(auVar114);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar108);
  auVar292._0_4_ = auVar115._0_4_ * fVar220;
  auVar292._4_4_ = auVar115._4_4_ * fVar240;
  auVar292._8_4_ = auVar115._8_4_ * fVar242;
  auVar292._12_4_ = auVar115._12_4_ * fVar244;
  auVar115 = vcvtdq2ps_avx(auVar83);
  auVar115 = vsubps_avx(auVar115,auVar108);
  auVar109._0_4_ = fVar220 * auVar115._0_4_;
  auVar109._4_4_ = fVar240 * auVar115._4_4_;
  auVar109._8_4_ = fVar242 * auVar115._8_4_;
  auVar109._12_4_ = fVar244 * auVar115._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar74 + uVar70 + 6);
  auVar115 = vpmovsxwd_avx(auVar12);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar77);
  auVar223._0_4_ = auVar115._0_4_ * fVar174;
  auVar223._4_4_ = auVar115._4_4_ * fVar188;
  auVar223._8_4_ = auVar115._8_4_ * fVar189;
  auVar223._12_4_ = auVar115._12_4_ * fVar190;
  local_7b0 = prim;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar70 * 0x17 + 6);
  auVar115 = vpmovsxwd_avx(auVar13);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar77);
  auVar78._0_4_ = auVar115._0_4_ * fVar174;
  auVar78._4_4_ = auVar115._4_4_ * fVar188;
  auVar78._8_4_ = auVar115._8_4_ * fVar189;
  auVar78._12_4_ = auVar115._12_4_ * fVar190;
  auVar115 = vpminsd_avx(auVar159,auVar197);
  auVar83 = vpminsd_avx(auVar292,auVar109);
  auVar115 = vmaxps_avx(auVar115,auVar83);
  auVar83 = vpminsd_avx(auVar223,auVar78);
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar296._4_4_ = uVar2;
  auVar296._0_4_ = uVar2;
  auVar296._8_4_ = uVar2;
  auVar296._12_4_ = uVar2;
  auVar83 = vmaxps_avx(auVar83,auVar296);
  auVar115 = vmaxps_avx(auVar115,auVar83);
  local_490._0_4_ = auVar115._0_4_ * 0.99999964;
  local_490._4_4_ = auVar115._4_4_ * 0.99999964;
  local_490._8_4_ = auVar115._8_4_ * 0.99999964;
  local_490._12_4_ = auVar115._12_4_ * 0.99999964;
  auVar115 = vpmaxsd_avx(auVar159,auVar197);
  auVar83 = vpmaxsd_avx(auVar292,auVar109);
  auVar115 = vminps_avx(auVar115,auVar83);
  auVar83 = vpmaxsd_avx(auVar223,auVar78);
  fVar220 = (ray->super_RayK<1>).tfar;
  auVar160._4_4_ = fVar220;
  auVar160._0_4_ = fVar220;
  auVar160._8_4_ = fVar220;
  auVar160._12_4_ = fVar220;
  auVar83 = vminps_avx(auVar83,auVar160);
  auVar115 = vminps_avx(auVar115,auVar83);
  auVar79._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar115 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar83 = vpcmpgtd_avx(auVar115,_DAT_01ff0cf0);
  auVar115 = vcmpps_avx(local_490,auVar79,2);
  auVar115 = vandps_avx(auVar115,auVar83);
  uVar69 = vmovmskps_avx(auVar115);
  if (uVar69 == 0) {
    return;
  }
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  uVar69 = uVar69 & 0xff;
  local_3c0 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
LAB_00f176cc:
  local_7a8 = (ulong)uVar69;
  lVar72 = 0;
  if ((ulong)uVar69 != 0) {
    for (; (uVar69 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  local_aa8 = (ulong)*(uint *)(local_7b0 + 2);
  pGVar8 = (context->scene->geometries).items[*(uint *)(local_7b0 + 2)].ptr;
  local_a48 = (ulong)*(uint *)(local_7b0 + lVar72 * 4 + 6);
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar74 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_7b0 + lVar72 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar115 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar74);
  auVar83 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * (uVar74 + 1));
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + uVar74 * (long)pGVar8[2].pointQueryFunc);
  auVar198._0_4_ = auVar115._0_4_ + *pfVar1 * 0.33333334;
  auVar198._4_4_ = auVar115._4_4_ + pfVar1[1] * 0.33333334;
  auVar198._8_4_ = auVar115._8_4_ + pfVar1[2] * 0.33333334;
  auVar198._12_4_ = auVar115._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * (uVar74 + 1));
  auVar80._0_4_ = *pfVar1 * 0.33333334;
  auVar80._4_4_ = pfVar1[1] * 0.33333334;
  auVar80._8_4_ = pfVar1[2] * 0.33333334;
  auVar80._12_4_ = pfVar1[3] * 0.33333334;
  auVar13 = vsubps_avx(auVar83,auVar80);
  auVar81._0_4_ = (auVar83._0_4_ + auVar115._0_4_ + auVar198._0_4_ + auVar13._0_4_) * 0.25;
  auVar81._4_4_ = (auVar83._4_4_ + auVar115._4_4_ + auVar198._4_4_ + auVar13._4_4_) * 0.25;
  auVar81._8_4_ = (auVar83._8_4_ + auVar115._8_4_ + auVar198._8_4_ + auVar13._8_4_) * 0.25;
  auVar81._12_4_ = (auVar83._12_4_ + auVar115._12_4_ + auVar198._12_4_ + auVar13._12_4_) * 0.25;
  aVar4 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar5 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar88 = vsubps_avx(auVar81,(undefined1  [16])aVar4);
  auVar88 = vdpps_avx(auVar88,(undefined1  [16])aVar5,0x7f);
  auVar114 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  auVar12 = vrcpss_avx(auVar114,auVar114);
  fVar220 = auVar88._0_4_ * auVar12._0_4_ * (2.0 - auVar12._0_4_ * auVar114._0_4_);
  local_7c0 = ZEXT416((uint)fVar220);
  auVar114 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
  fVar220 = aVar5.x;
  fVar174 = aVar5.y;
  fVar240 = aVar5.z;
  aVar147 = aVar5.field_3;
  auVar252._0_4_ = aVar4.x + fVar220 * auVar114._0_4_;
  auVar252._4_4_ = aVar4.y + fVar174 * auVar114._4_4_;
  auVar252._8_4_ = aVar4.z + fVar240 * auVar114._8_4_;
  auVar252._12_4_ = aVar4.field_3.w + aVar147.w * auVar114._12_4_;
  auVar88 = vblendps_avx(auVar252,_DAT_01feba10,8);
  _local_990 = vsubps_avx(auVar115,auVar88);
  _local_9a0 = vsubps_avx(auVar13,auVar88);
  auVar229._8_4_ = 0x3f800000;
  auVar229._0_8_ = &DAT_3f8000003f800000;
  auVar229._12_4_ = 0x3f800000;
  auVar229._16_4_ = 0x3f800000;
  auVar229._20_4_ = 0x3f800000;
  auVar229._24_4_ = 0x3f800000;
  auVar229._28_4_ = 0x3f800000;
  _local_9b0 = vsubps_avx(auVar198,auVar88);
  auVar211 = ZEXT1664(_local_9b0);
  _local_9c0 = vsubps_avx(auVar83,auVar88);
  auVar115 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar115;
  _local_1a0 = auVar115;
  auVar115 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar115;
  _local_1c0 = auVar115;
  auVar115 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar115;
  _local_1e0 = auVar115;
  auVar115 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001290 = auVar115;
  _local_200 = auVar115;
  auVar115 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001290 = auVar115;
  _local_220 = auVar115;
  auVar115 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001290 = auVar115;
  _local_240 = auVar115;
  auVar115 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001290 = auVar115;
  _local_260 = auVar115;
  auVar110._0_4_ = fVar220 * fVar220;
  auVar110._4_4_ = fVar174 * fVar174;
  auVar110._8_4_ = fVar240 * fVar240;
  auVar110._12_4_ = aVar147.w * aVar147.w;
  auVar115 = vshufps_avx(auVar110,auVar110,0xaa);
  auVar83 = vshufps_avx(auVar110,auVar110,0x55);
  auVar88 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  auVar184._16_16_ = auVar88;
  auVar184._0_16_ = auVar88;
  _local_280 = auVar184;
  auVar88 = vshufps_avx(auVar110,auVar110,0);
  local_2a0._0_4_ = auVar88._0_4_ + auVar83._0_4_ + auVar115._0_4_;
  local_2a0._4_4_ = auVar88._4_4_ + auVar83._4_4_ + auVar115._4_4_;
  local_2a0._8_4_ = auVar88._8_4_ + auVar83._8_4_ + auVar115._8_4_;
  local_2a0._12_4_ = auVar88._12_4_ + auVar83._12_4_ + auVar115._12_4_;
  local_2a0._16_4_ = auVar88._0_4_ + auVar83._0_4_ + auVar115._0_4_;
  local_2a0._20_4_ = auVar88._4_4_ + auVar83._4_4_ + auVar115._4_4_;
  local_2a0._24_4_ = auVar88._8_4_ + auVar83._8_4_ + auVar115._8_4_;
  local_2a0._28_4_ = auVar88._12_4_ + auVar83._12_4_ + auVar115._12_4_;
  auVar115 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001250 = auVar115;
  _local_2c0 = auVar115;
  auVar115 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar115;
  _local_2e0 = auVar115;
  auVar115 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar115;
  _local_300 = auVar115;
  auVar115 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar115;
  _local_320 = auVar115;
  auVar115 = vshufps_avx(_local_9c0,_local_9c0,0);
  register0x00001250 = auVar115;
  _local_340 = auVar115;
  auVar115 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001250 = auVar115;
  _local_360 = auVar115;
  auVar115 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001250 = auVar115;
  _local_380 = auVar115;
  auVar115 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x00001250 = auVar115;
  _local_3a0 = auVar115;
  register0x00001390 = auVar114;
  _local_8a0 = auVar114;
  auVar262 = ZEXT3264(_local_8a0);
  uVar74 = 1;
  uVar70 = 0;
  local_500 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_540 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  local_3e0 = vandps_avx(local_2a0,auVar93);
  auVar285 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_a40 = auVar285._0_16_;
    auVar115 = vmovshdup_avx(local_a40);
    fVar220 = auVar115._0_4_ - auVar285._0_4_;
    auVar115 = vshufps_avx(local_a40,local_a40,0);
    local_7e0._16_16_ = auVar115;
    local_7e0._0_16_ = auVar115;
    auVar83 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
    _fStack_8d0 = auVar83;
    _local_8e0 = auVar83;
    fVar106 = auVar83._0_4_;
    fVar142 = auVar83._4_4_;
    fVar145 = auVar83._8_4_;
    fVar148 = auVar83._12_4_;
    fVar76 = auVar115._0_4_;
    auVar123._0_4_ = fVar76 + fVar106 * 0.0;
    fVar103 = auVar115._4_4_;
    auVar123._4_4_ = fVar103 + fVar142 * 0.14285715;
    fVar104 = auVar115._8_4_;
    auVar123._8_4_ = fVar104 + fVar145 * 0.2857143;
    fVar105 = auVar115._12_4_;
    auVar123._12_4_ = fVar105 + fVar148 * 0.42857146;
    auVar123._16_4_ = fVar76 + fVar106 * 0.5714286;
    auVar123._20_4_ = fVar103 + fVar142 * 0.71428573;
    auVar123._24_4_ = fVar104 + fVar145 * 0.8571429;
    auVar123._28_4_ = fVar105 + fVar148;
    auVar98 = vsubps_avx(auVar229,auVar123);
    fVar174 = auVar98._0_4_;
    fVar240 = auVar98._4_4_;
    fVar188 = auVar98._8_4_;
    fVar242 = auVar98._12_4_;
    fVar189 = auVar98._16_4_;
    fVar244 = auVar98._20_4_;
    fVar190 = auVar98._24_4_;
    fVar194 = auVar184._28_4_;
    fVar250 = (float)local_2c0._0_4_ * auVar123._0_4_ + (float)local_220._0_4_ * fVar174;
    fVar264 = (float)local_2c0._4_4_ * auVar123._4_4_ + (float)local_220._4_4_ * fVar240;
    fVar266 = fStack_2b8 * auVar123._8_4_ + fStack_218 * fVar188;
    fVar269 = fStack_2b4 * auVar123._12_4_ + fStack_214 * fVar242;
    fVar271 = fStack_2b0 * auVar123._16_4_ + fStack_210 * fVar189;
    fVar273 = fStack_2ac * auVar123._20_4_ + fStack_20c * fVar244;
    fVar275 = fStack_2a8 * auVar123._24_4_ + fStack_208 * fVar190;
    fVar249 = (float)local_2e0._0_4_ * auVar123._0_4_ + (float)local_240._0_4_ * fVar174;
    fVar263 = (float)local_2e0._4_4_ * auVar123._4_4_ + (float)local_240._4_4_ * fVar240;
    fVar265 = fStack_2d8 * auVar123._8_4_ + fStack_238 * fVar188;
    fVar268 = fStack_2d4 * auVar123._12_4_ + fStack_234 * fVar242;
    fVar191 = fStack_2d0 * auVar123._16_4_ + fStack_230 * fVar189;
    fVar192 = fStack_2cc * auVar123._20_4_ + fStack_22c * fVar244;
    fVar193 = fStack_2c8 * auVar123._24_4_ + fStack_228 * fVar190;
    fVar195 = (float)local_300._0_4_ * auVar123._0_4_ + (float)local_260._0_4_ * fVar174;
    fVar212 = (float)local_300._4_4_ * auVar123._4_4_ + (float)local_260._4_4_ * fVar240;
    fVar213 = fStack_2f8 * auVar123._8_4_ + fStack_258 * fVar188;
    fVar214 = fStack_2f4 * auVar123._12_4_ + fStack_254 * fVar242;
    fVar215 = fStack_2f0 * auVar123._16_4_ + fStack_250 * fVar189;
    fVar216 = fStack_2ec * auVar123._20_4_ + fStack_24c * fVar244;
    fVar218 = fStack_2e8 * auVar123._24_4_ + fStack_248 * fVar190;
    fVar221 = (float)local_320._0_4_ * auVar123._0_4_ + (float)local_280._0_4_ * fVar174;
    fVar241 = (float)local_320._4_4_ * auVar123._4_4_ + (float)local_280._4_4_ * fVar240;
    fVar243 = fStack_318 * auVar123._8_4_ + fStack_278 * fVar188;
    fVar245 = fStack_314 * auVar123._12_4_ + fStack_274 * fVar242;
    fVar246 = fStack_310 * auVar123._16_4_ + fStack_270 * fVar189;
    fVar247 = fStack_30c * auVar123._20_4_ + fStack_26c * fVar244;
    fVar248 = fStack_308 * auVar123._24_4_ + fStack_268 * fVar190;
    fVar308 = auVar307._28_4_;
    fVar340 = fVar308 + fStack_224;
    fVar322 = fStack_204 + fVar308;
    auVar299._0_4_ =
         ((float)local_220._0_4_ * auVar123._0_4_ + fVar174 * (float)local_1a0._0_4_) * fVar174 +
         auVar123._0_4_ * fVar250;
    auVar299._4_4_ =
         ((float)local_220._4_4_ * auVar123._4_4_ + fVar240 * (float)local_1a0._4_4_) * fVar240 +
         auVar123._4_4_ * fVar264;
    auVar299._8_4_ =
         (fStack_218 * auVar123._8_4_ + fVar188 * fStack_198) * fVar188 + auVar123._8_4_ * fVar266;
    auVar299._12_4_ =
         (fStack_214 * auVar123._12_4_ + fVar242 * fStack_194) * fVar242 + auVar123._12_4_ * fVar269
    ;
    auVar299._16_4_ =
         (fStack_210 * auVar123._16_4_ + fVar189 * fStack_190) * fVar189 + auVar123._16_4_ * fVar271
    ;
    auVar299._20_4_ =
         (fStack_20c * auVar123._20_4_ + fVar244 * fStack_18c) * fVar244 + auVar123._20_4_ * fVar273
    ;
    auVar299._24_4_ =
         (fStack_208 * auVar123._24_4_ + fVar190 * fStack_188) * fVar190 + auVar123._24_4_ * fVar275
    ;
    auVar299._28_4_ = fStack_304 + fVar308;
    auVar302._0_4_ =
         fVar174 * ((float)local_240._0_4_ * auVar123._0_4_ + fVar174 * (float)local_1c0._0_4_) +
         auVar123._0_4_ * fVar249;
    auVar302._4_4_ =
         fVar240 * ((float)local_240._4_4_ * auVar123._4_4_ + fVar240 * (float)local_1c0._4_4_) +
         auVar123._4_4_ * fVar263;
    auVar302._8_4_ =
         fVar188 * (fStack_238 * auVar123._8_4_ + fVar188 * fStack_1b8) + auVar123._8_4_ * fVar265;
    auVar302._12_4_ =
         fVar242 * (fStack_234 * auVar123._12_4_ + fVar242 * fStack_1b4) + auVar123._12_4_ * fVar268
    ;
    auVar302._16_4_ =
         fVar189 * (fStack_230 * auVar123._16_4_ + fVar189 * fStack_1b0) + auVar123._16_4_ * fVar191
    ;
    auVar302._20_4_ =
         fVar244 * (fStack_22c * auVar123._20_4_ + fVar244 * fStack_1ac) + auVar123._20_4_ * fVar192
    ;
    auVar302._24_4_ =
         fVar190 * (fStack_228 * auVar123._24_4_ + fVar190 * fStack_1a8) + auVar123._24_4_ * fVar193
    ;
    auVar302._28_4_ = fVar194 + auVar285._28_4_ + fVar308;
    auVar305._0_4_ =
         fVar174 * ((float)local_260._0_4_ * auVar123._0_4_ + fVar174 * (float)local_1e0._0_4_) +
         auVar123._0_4_ * fVar195;
    auVar305._4_4_ =
         fVar240 * ((float)local_260._4_4_ * auVar123._4_4_ + fVar240 * (float)local_1e0._4_4_) +
         auVar123._4_4_ * fVar212;
    auVar305._8_4_ =
         fVar188 * (fStack_258 * auVar123._8_4_ + fVar188 * fStack_1d8) + auVar123._8_4_ * fVar213;
    auVar305._12_4_ =
         fVar242 * (fStack_254 * auVar123._12_4_ + fVar242 * fStack_1d4) + auVar123._12_4_ * fVar214
    ;
    auVar305._16_4_ =
         fVar189 * (fStack_250 * auVar123._16_4_ + fVar189 * fStack_1d0) + auVar123._16_4_ * fVar215
    ;
    auVar305._20_4_ =
         fVar244 * (fStack_24c * auVar123._20_4_ + fVar244 * fStack_1cc) + auVar123._20_4_ * fVar216
    ;
    auVar305._24_4_ =
         fVar190 * (fStack_248 * auVar123._24_4_ + fVar190 * fStack_1c8) + auVar123._24_4_ * fVar218
    ;
    auVar305._28_4_ = fStack_2e4 + fVar308;
    auVar281._0_4_ =
         auVar123._0_4_ * fVar221 +
         fVar174 * ((float)local_280._0_4_ * auVar123._0_4_ + fVar174 * (float)local_200._0_4_);
    auVar281._4_4_ =
         auVar123._4_4_ * fVar241 +
         fVar240 * ((float)local_280._4_4_ * auVar123._4_4_ + fVar240 * (float)local_200._4_4_);
    auVar281._8_4_ =
         auVar123._8_4_ * fVar243 + fVar188 * (fStack_278 * auVar123._8_4_ + fVar188 * fStack_1f8);
    auVar281._12_4_ =
         auVar123._12_4_ * fVar245 + fVar242 * (fStack_274 * auVar123._12_4_ + fVar242 * fStack_1f4)
    ;
    auVar281._16_4_ =
         auVar123._16_4_ * fVar246 + fVar189 * (fStack_270 * auVar123._16_4_ + fVar189 * fStack_1f0)
    ;
    auVar281._20_4_ =
         auVar123._20_4_ * fVar247 + fVar244 * (fStack_26c * auVar123._20_4_ + fVar244 * fStack_1ec)
    ;
    auVar281._24_4_ =
         auVar123._24_4_ * fVar248 + fVar190 * (fStack_268 * auVar123._24_4_ + fVar190 * fStack_1e8)
    ;
    auVar281._28_4_ = fStack_2e4 + fStack_2c4;
    auVar342._0_4_ =
         (auVar123._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar174) *
         auVar123._0_4_ + fVar174 * fVar250;
    auVar342._4_4_ =
         (auVar123._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar240) *
         auVar123._4_4_ + fVar240 * fVar264;
    auVar342._8_4_ =
         (auVar123._8_4_ * fStack_338 + fStack_2b8 * fVar188) * auVar123._8_4_ + fVar188 * fVar266;
    auVar342._12_4_ =
         (auVar123._12_4_ * fStack_334 + fStack_2b4 * fVar242) * auVar123._12_4_ + fVar242 * fVar269
    ;
    auVar342._16_4_ =
         (auVar123._16_4_ * fStack_330 + fStack_2b0 * fVar189) * auVar123._16_4_ + fVar189 * fVar271
    ;
    auVar342._20_4_ =
         (auVar123._20_4_ * fStack_32c + fStack_2ac * fVar244) * auVar123._20_4_ + fVar244 * fVar273
    ;
    auVar342._24_4_ =
         (auVar123._24_4_ * fStack_328 + fStack_2a8 * fVar190) * auVar123._24_4_ + fVar190 * fVar275
    ;
    auVar342._28_4_ = fStack_2e4 + fVar194 + auVar262._28_4_;
    auVar185._0_4_ =
         (auVar123._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar174) *
         auVar123._0_4_ + fVar174 * fVar249;
    auVar185._4_4_ =
         (auVar123._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar240) *
         auVar123._4_4_ + fVar240 * fVar263;
    auVar185._8_4_ =
         (auVar123._8_4_ * fStack_358 + fStack_2d8 * fVar188) * auVar123._8_4_ + fVar188 * fVar265;
    auVar185._12_4_ =
         (auVar123._12_4_ * fStack_354 + fStack_2d4 * fVar242) * auVar123._12_4_ + fVar242 * fVar268
    ;
    auVar185._16_4_ =
         (auVar123._16_4_ * fStack_350 + fStack_2d0 * fVar189) * auVar123._16_4_ + fVar189 * fVar191
    ;
    auVar185._20_4_ =
         (auVar123._20_4_ * fStack_34c + fStack_2cc * fVar244) * auVar123._20_4_ + fVar244 * fVar192
    ;
    auVar185._24_4_ =
         (auVar123._24_4_ * fStack_348 + fStack_2c8 * fVar190) * auVar123._24_4_ + fVar190 * fVar193
    ;
    auVar185._28_4_ = fStack_2e4 + auVar211._28_4_ + fVar194;
    auVar208._0_4_ =
         auVar123._0_4_ *
         (auVar123._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar174) +
         fVar174 * fVar195;
    auVar208._4_4_ =
         auVar123._4_4_ *
         (auVar123._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar240) +
         fVar240 * fVar212;
    auVar208._8_4_ =
         auVar123._8_4_ * (auVar123._8_4_ * fStack_378 + fStack_2f8 * fVar188) + fVar188 * fVar213;
    auVar208._12_4_ =
         auVar123._12_4_ * (auVar123._12_4_ * fStack_374 + fStack_2f4 * fVar242) + fVar242 * fVar214
    ;
    auVar208._16_4_ =
         auVar123._16_4_ * (auVar123._16_4_ * fStack_370 + fStack_2f0 * fVar189) + fVar189 * fVar215
    ;
    auVar208._20_4_ =
         auVar123._20_4_ * (auVar123._20_4_ * fStack_36c + fStack_2ec * fVar244) + fVar244 * fVar216
    ;
    auVar208._24_4_ =
         auVar123._24_4_ * (auVar123._24_4_ * fStack_368 + fStack_2e8 * fVar190) + fVar190 * fVar218
    ;
    auVar208._28_4_ = fVar322 + auVar229._28_4_ + auVar211._28_4_;
    auVar230._0_4_ =
         (auVar123._0_4_ * (float)local_3a0._0_4_ + (float)local_320._0_4_ * fVar174) *
         auVar123._0_4_ + fVar174 * fVar221;
    auVar230._4_4_ =
         (auVar123._4_4_ * (float)local_3a0._4_4_ + (float)local_320._4_4_ * fVar240) *
         auVar123._4_4_ + fVar240 * fVar241;
    auVar230._8_4_ =
         (auVar123._8_4_ * fStack_398 + fStack_318 * fVar188) * auVar123._8_4_ + fVar188 * fVar243;
    auVar230._12_4_ =
         (auVar123._12_4_ * fStack_394 + fStack_314 * fVar242) * auVar123._12_4_ + fVar242 * fVar245
    ;
    auVar230._16_4_ =
         (auVar123._16_4_ * fStack_390 + fStack_310 * fVar189) * auVar123._16_4_ + fVar189 * fVar246
    ;
    auVar230._20_4_ =
         (auVar123._20_4_ * fStack_38c + fStack_30c * fVar244) * auVar123._20_4_ + fVar244 * fVar247
    ;
    auVar230._24_4_ =
         (auVar123._24_4_ * fStack_388 + fStack_308 * fVar190) * auVar123._24_4_ + fVar190 * fVar248
    ;
    auVar230._28_4_ = fVar340 + fVar308 + auVar229._28_4_;
    local_aa0 = auVar299._0_4_ * fVar174 + auVar342._0_4_ * auVar123._0_4_;
    fStack_a9c = auVar299._4_4_ * fVar240 + auVar342._4_4_ * auVar123._4_4_;
    fStack_a98 = auVar299._8_4_ * fVar188 + auVar342._8_4_ * auVar123._8_4_;
    fStack_a94 = auVar299._12_4_ * fVar242 + auVar342._12_4_ * auVar123._12_4_;
    fStack_a90 = auVar299._16_4_ * fVar189 + auVar342._16_4_ * auVar123._16_4_;
    fStack_a8c = auVar299._20_4_ * fVar244 + auVar342._20_4_ * auVar123._20_4_;
    fStack_a88 = auVar299._24_4_ * fVar190 + auVar342._24_4_ * auVar123._24_4_;
    fStack_a84 = fVar340 + fStack_2e4;
    local_560._0_4_ = auVar302._0_4_ * fVar174 + auVar123._0_4_ * auVar185._0_4_;
    local_560._4_4_ = auVar302._4_4_ * fVar240 + auVar123._4_4_ * auVar185._4_4_;
    local_560._8_4_ = auVar302._8_4_ * fVar188 + auVar123._8_4_ * auVar185._8_4_;
    local_560._12_4_ = auVar302._12_4_ * fVar242 + auVar123._12_4_ * auVar185._12_4_;
    local_560._16_4_ = auVar302._16_4_ * fVar189 + auVar123._16_4_ * auVar185._16_4_;
    local_560._20_4_ = auVar302._20_4_ * fVar244 + auVar123._20_4_ * auVar185._20_4_;
    local_560._24_4_ = auVar302._24_4_ * fVar190 + auVar123._24_4_ * auVar185._24_4_;
    local_560._28_4_ = fStack_2e4 + fVar322;
    local_780._0_4_ = auVar305._0_4_ * fVar174 + auVar123._0_4_ * auVar208._0_4_;
    local_780._4_4_ = auVar305._4_4_ * fVar240 + auVar123._4_4_ * auVar208._4_4_;
    local_780._8_4_ = auVar305._8_4_ * fVar188 + auVar123._8_4_ * auVar208._8_4_;
    local_780._12_4_ = auVar305._12_4_ * fVar242 + auVar123._12_4_ * auVar208._12_4_;
    local_780._16_4_ = auVar305._16_4_ * fVar189 + auVar123._16_4_ * auVar208._16_4_;
    local_780._20_4_ = auVar305._20_4_ * fVar244 + auVar123._20_4_ * auVar208._20_4_;
    local_780._24_4_ = auVar305._24_4_ * fVar190 + auVar123._24_4_ * auVar208._24_4_;
    local_780._28_4_ = fVar322 + fStack_2e4;
    local_820._0_4_ = fVar174 * auVar281._0_4_ + auVar123._0_4_ * auVar230._0_4_;
    local_820._4_4_ = fVar240 * auVar281._4_4_ + auVar123._4_4_ * auVar230._4_4_;
    local_820._8_4_ = fVar188 * auVar281._8_4_ + auVar123._8_4_ * auVar230._8_4_;
    local_820._12_4_ = fVar242 * auVar281._12_4_ + auVar123._12_4_ * auVar230._12_4_;
    local_820._16_4_ = fVar189 * auVar281._16_4_ + auVar123._16_4_ * auVar230._16_4_;
    local_820._20_4_ = fVar244 * auVar281._20_4_ + auVar123._20_4_ * auVar230._20_4_;
    local_820._24_4_ = fVar190 * auVar281._24_4_ + auVar123._24_4_ * auVar230._24_4_;
    local_820._28_4_ = auVar98._28_4_ + auVar123._28_4_;
    auVar93 = vsubps_avx(auVar342,auVar299);
    auVar98 = vsubps_avx(auVar185,auVar302);
    auVar184 = vsubps_avx(auVar208,auVar305);
    auVar229 = vsubps_avx(auVar230,auVar281);
    auVar115 = vshufps_avx(ZEXT416((uint)(fVar220 * 0.04761905)),
                           ZEXT416((uint)(fVar220 * 0.04761905)),0);
    fVar212 = auVar115._0_4_;
    fVar277 = fVar212 * auVar93._0_4_ * 3.0;
    fVar213 = auVar115._4_4_;
    fVar286 = fVar213 * auVar93._4_4_ * 3.0;
    local_8c0._4_4_ = fVar286;
    local_8c0._0_4_ = fVar277;
    fVar221 = auVar115._8_4_;
    fVar287 = fVar221 * auVar93._8_4_ * 3.0;
    fStack_8b8 = fVar287;
    fVar191 = auVar115._12_4_;
    fVar288 = fVar191 * auVar93._12_4_ * 3.0;
    fStack_8b4 = fVar288;
    fVar289 = fVar212 * auVar93._16_4_ * 3.0;
    unique0x100078e4 = fVar289;
    fVar290 = fVar213 * auVar93._20_4_ * 3.0;
    unique0x100078e8 = fVar290;
    fVar291 = fVar221 * auVar93._24_4_ * 3.0;
    unique0x100078ec = fVar291;
    unique0x100078f0 = auVar281._28_4_;
    fVar309 = fVar212 * auVar98._0_4_ * 3.0;
    fVar315 = fVar213 * auVar98._4_4_ * 3.0;
    local_860._4_4_ = fVar315;
    local_860._0_4_ = fVar309;
    fVar317 = fVar221 * auVar98._8_4_ * 3.0;
    local_860._8_4_ = fVar317;
    fVar318 = fVar191 * auVar98._12_4_ * 3.0;
    local_860._12_4_ = fVar318;
    fVar319 = fVar212 * auVar98._16_4_ * 3.0;
    local_860._16_4_ = fVar319;
    fVar320 = fVar213 * auVar98._20_4_ * 3.0;
    local_860._20_4_ = fVar320;
    fVar321 = fVar221 * auVar98._24_4_ * 3.0;
    local_860._24_4_ = fVar321;
    local_860._28_4_ = fVar322;
    fVar324 = fVar212 * auVar184._0_4_ * 3.0;
    fVar328 = fVar213 * auVar184._4_4_ * 3.0;
    local_9e0._4_4_ = fVar328;
    local_9e0._0_4_ = fVar324;
    fVar330 = fVar221 * auVar184._8_4_ * 3.0;
    local_9e0._8_4_ = fVar330;
    fVar332 = fVar191 * auVar184._12_4_ * 3.0;
    local_9e0._12_4_ = fVar332;
    fVar334 = fVar212 * auVar184._16_4_ * 3.0;
    local_9e0._16_4_ = fVar334;
    fVar336 = fVar213 * auVar184._20_4_ * 3.0;
    local_9e0._20_4_ = fVar336;
    fVar338 = fVar221 * auVar184._24_4_ * 3.0;
    local_9e0._24_4_ = fVar338;
    local_9e0._28_4_ = fVar340;
    fVar189 = fVar212 * auVar229._0_4_ * 3.0;
    fVar244 = fVar213 * auVar229._4_4_ * 3.0;
    auVar168._4_4_ = fVar244;
    auVar168._0_4_ = fVar189;
    fVar268 = fVar221 * auVar229._8_4_ * 3.0;
    auVar168._8_4_ = fVar268;
    fVar191 = fVar191 * auVar229._12_4_ * 3.0;
    auVar168._12_4_ = fVar191;
    fVar212 = fVar212 * auVar229._16_4_ * 3.0;
    auVar168._16_4_ = fVar212;
    fVar213 = fVar213 * auVar229._20_4_ * 3.0;
    auVar168._20_4_ = fVar213;
    fVar221 = fVar221 * auVar229._24_4_ * 3.0;
    auVar168._24_4_ = fVar221;
    auVar168._28_4_ = auVar93._28_4_;
    auVar98 = vperm2f128_avx(local_560,local_560,1);
    auVar98 = vshufps_avx(auVar98,local_560,0x30);
    local_a80 = vshufps_avx(local_560,auVar98,0x29);
    auVar98 = vperm2f128_avx(local_780,local_780,1);
    auVar98 = vshufps_avx(auVar98,local_780,0x30);
    _local_980 = vshufps_avx(local_780,auVar98,0x29);
    auVar184 = vsubps_avx(local_820,auVar168);
    auVar98 = vperm2f128_avx(auVar184,auVar184,1);
    auVar98 = vshufps_avx(auVar98,auVar184,0x30);
    _local_840 = vshufps_avx(auVar184,auVar98,0x29);
    _local_660 = vsubps_avx(local_a80,local_560);
    _local_580 = vsubps_avx(_local_980,local_780);
    fVar174 = local_660._0_4_;
    fVar190 = local_660._4_4_;
    auVar14._4_4_ = fVar328 * fVar190;
    auVar14._0_4_ = fVar324 * fVar174;
    fVar192 = local_660._8_4_;
    auVar14._8_4_ = fVar330 * fVar192;
    fVar214 = local_660._12_4_;
    auVar14._12_4_ = fVar332 * fVar214;
    fVar243 = local_660._16_4_;
    auVar14._16_4_ = fVar334 * fVar243;
    fVar264 = local_660._20_4_;
    auVar14._20_4_ = fVar336 * fVar264;
    fVar308 = local_660._24_4_;
    auVar14._24_4_ = fVar338 * fVar308;
    auVar14._28_4_ = auVar184._28_4_;
    fVar240 = local_580._0_4_;
    fVar249 = local_580._4_4_;
    auVar327._4_4_ = fVar315 * fVar249;
    auVar327._0_4_ = fVar309 * fVar240;
    fVar193 = local_580._8_4_;
    auVar327._8_4_ = fVar317 * fVar193;
    fVar215 = local_580._12_4_;
    auVar327._12_4_ = fVar318 * fVar215;
    fVar245 = local_580._16_4_;
    auVar327._16_4_ = fVar319 * fVar245;
    fVar266 = local_580._20_4_;
    auVar327._20_4_ = fVar320 * fVar266;
    fVar340 = local_580._24_4_;
    auVar327._24_4_ = fVar321 * fVar340;
    auVar327._28_4_ = auVar98._28_4_;
    auVar229 = vsubps_avx(auVar327,auVar14);
    auVar65._4_4_ = fStack_a9c;
    auVar65._0_4_ = local_aa0;
    auVar65._8_4_ = fStack_a98;
    auVar65._12_4_ = fStack_a94;
    auVar65._16_4_ = fStack_a90;
    auVar65._20_4_ = fStack_a8c;
    auVar65._24_4_ = fStack_a88;
    auVar65._28_4_ = fStack_a84;
    auVar98 = vperm2f128_avx(auVar65,auVar65,1);
    auVar98 = vshufps_avx(auVar98,auVar65,0x30);
    local_6e0 = vshufps_avx(auVar65,auVar98,0x29);
    _local_680 = vsubps_avx(local_6e0,auVar65);
    auVar15._4_4_ = fVar249 * fVar286;
    auVar15._0_4_ = fVar240 * fVar277;
    auVar15._8_4_ = fVar193 * fVar287;
    auVar15._12_4_ = fVar215 * fVar288;
    auVar15._16_4_ = fVar245 * fVar289;
    auVar15._20_4_ = fVar266 * fVar290;
    auVar15._24_4_ = fVar340 * fVar291;
    auVar15._28_4_ = auVar98._28_4_;
    fVar188 = local_680._0_4_;
    fVar263 = local_680._4_4_;
    auVar258._4_4_ = fVar328 * fVar263;
    auVar258._0_4_ = fVar324 * fVar188;
    fVar194 = local_680._8_4_;
    auVar258._8_4_ = fVar330 * fVar194;
    fVar216 = local_680._12_4_;
    auVar258._12_4_ = fVar332 * fVar216;
    fVar246 = local_680._16_4_;
    auVar258._16_4_ = fVar334 * fVar246;
    fVar269 = local_680._20_4_;
    auVar258._20_4_ = fVar336 * fVar269;
    fVar11 = local_680._24_4_;
    auVar258._24_4_ = fVar338 * fVar11;
    auVar258._28_4_ = fStack_a84;
    auVar168 = vsubps_avx(auVar258,auVar15);
    auVar16._4_4_ = fVar315 * fVar263;
    auVar16._0_4_ = fVar309 * fVar188;
    auVar16._8_4_ = fVar317 * fVar194;
    auVar16._12_4_ = fVar318 * fVar216;
    auVar16._16_4_ = fVar319 * fVar246;
    auVar16._20_4_ = fVar320 * fVar269;
    auVar16._24_4_ = fVar321 * fVar11;
    auVar16._28_4_ = fStack_a84;
    auVar17._4_4_ = fVar190 * fVar286;
    auVar17._0_4_ = fVar174 * fVar277;
    auVar17._8_4_ = fVar192 * fVar287;
    auVar17._12_4_ = fVar214 * fVar288;
    auVar17._16_4_ = fVar243 * fVar289;
    auVar17._20_4_ = fVar264 * fVar290;
    auVar17._24_4_ = fVar308 * fVar291;
    auVar17._28_4_ = auVar302._28_4_;
    auVar14 = vsubps_avx(auVar17,auVar16);
    fVar220 = auVar14._28_4_;
    auVar167._0_4_ = fVar188 * fVar188 + fVar174 * fVar174 + fVar240 * fVar240;
    auVar167._4_4_ = fVar263 * fVar263 + fVar190 * fVar190 + fVar249 * fVar249;
    auVar167._8_4_ = fVar194 * fVar194 + fVar192 * fVar192 + fVar193 * fVar193;
    auVar167._12_4_ = fVar216 * fVar216 + fVar214 * fVar214 + fVar215 * fVar215;
    auVar167._16_4_ = fVar246 * fVar246 + fVar243 * fVar243 + fVar245 * fVar245;
    auVar167._20_4_ = fVar269 * fVar269 + fVar264 * fVar264 + fVar266 * fVar266;
    auVar167._24_4_ = fVar11 * fVar11 + fVar308 * fVar308 + fVar340 * fVar340;
    auVar167._28_4_ = fVar220 + fVar220 + auVar229._28_4_;
    auVar98 = vrcpps_avx(auVar167);
    fVar241 = auVar98._0_4_;
    fVar248 = auVar98._4_4_;
    auVar18._4_4_ = fVar248 * auVar167._4_4_;
    auVar18._0_4_ = fVar241 * auVar167._0_4_;
    fVar250 = auVar98._8_4_;
    auVar18._8_4_ = fVar250 * auVar167._8_4_;
    fVar273 = auVar98._12_4_;
    auVar18._12_4_ = fVar273 * auVar167._12_4_;
    fVar275 = auVar98._16_4_;
    auVar18._16_4_ = fVar275 * auVar167._16_4_;
    fVar217 = auVar98._20_4_;
    auVar18._20_4_ = fVar217 * auVar167._20_4_;
    fVar219 = auVar98._24_4_;
    auVar18._24_4_ = fVar219 * auVar167._24_4_;
    auVar18._28_4_ = auVar302._28_4_;
    auVar343._8_4_ = 0x3f800000;
    auVar343._0_8_ = &DAT_3f8000003f800000;
    auVar343._12_4_ = 0x3f800000;
    auVar343._16_4_ = 0x3f800000;
    auVar343._20_4_ = 0x3f800000;
    auVar343._24_4_ = 0x3f800000;
    auVar343._28_4_ = 0x3f800000;
    auVar327 = vsubps_avx(auVar343,auVar18);
    fVar241 = auVar327._0_4_ * fVar241 + fVar241;
    fVar248 = auVar327._4_4_ * fVar248 + fVar248;
    fVar250 = auVar327._8_4_ * fVar250 + fVar250;
    fVar273 = auVar327._12_4_ * fVar273 + fVar273;
    fVar275 = auVar327._16_4_ * fVar275 + fVar275;
    fVar217 = auVar327._20_4_ * fVar217 + fVar217;
    fVar219 = auVar327._24_4_ * fVar219 + fVar219;
    auVar184 = vperm2f128_avx(local_860,local_860,1);
    auVar184 = vshufps_avx(auVar184,local_860,0x30);
    local_940 = vshufps_avx(local_860,auVar184,0x29);
    auVar184 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar184 = vshufps_avx(auVar184,local_9e0,0x30);
    local_960 = vshufps_avx(local_9e0,auVar184,0x29);
    fVar325 = local_960._0_4_;
    fVar329 = local_960._4_4_;
    auVar19._4_4_ = fVar329 * fVar190;
    auVar19._0_4_ = fVar325 * fVar174;
    fVar331 = local_960._8_4_;
    auVar19._8_4_ = fVar331 * fVar192;
    fVar333 = local_960._12_4_;
    auVar19._12_4_ = fVar333 * fVar214;
    fVar335 = local_960._16_4_;
    auVar19._16_4_ = fVar335 * fVar243;
    fVar337 = local_960._20_4_;
    auVar19._20_4_ = fVar337 * fVar264;
    fVar339 = local_960._24_4_;
    auVar19._24_4_ = fVar339 * fVar308;
    auVar19._28_4_ = auVar184._28_4_;
    fVar341 = local_940._0_4_;
    fVar345 = local_940._4_4_;
    auVar20._4_4_ = fVar345 * fVar249;
    auVar20._0_4_ = fVar341 * fVar240;
    fVar346 = local_940._8_4_;
    auVar20._8_4_ = fVar346 * fVar193;
    fVar347 = local_940._12_4_;
    auVar20._12_4_ = fVar347 * fVar215;
    fVar348 = local_940._16_4_;
    auVar20._16_4_ = fVar348 * fVar245;
    fVar349 = local_940._20_4_;
    auVar20._20_4_ = fVar349 * fVar266;
    fVar350 = local_940._24_4_;
    auVar20._24_4_ = fVar350 * fVar340;
    auVar20._28_4_ = fVar322;
    auVar15 = vsubps_avx(auVar20,auVar19);
    auVar184 = vperm2f128_avx(_local_8c0,_local_8c0,1);
    auVar184 = vshufps_avx(auVar184,_local_8c0,0x30);
    local_880 = vshufps_avx(_local_8c0,auVar184,0x29);
    fVar242 = local_880._0_4_;
    fVar265 = local_880._4_4_;
    auVar21._4_4_ = fVar249 * fVar265;
    auVar21._0_4_ = fVar240 * fVar242;
    fVar195 = local_880._8_4_;
    auVar21._8_4_ = fVar193 * fVar195;
    fVar218 = local_880._12_4_;
    auVar21._12_4_ = fVar215 * fVar218;
    fVar247 = local_880._16_4_;
    auVar21._16_4_ = fVar245 * fVar247;
    fVar271 = local_880._20_4_;
    auVar21._20_4_ = fVar266 * fVar271;
    fVar322 = local_880._24_4_;
    auVar21._24_4_ = fVar340 * fVar322;
    auVar21._28_4_ = auVar184._28_4_;
    auVar22._4_4_ = fVar329 * fVar263;
    auVar22._0_4_ = fVar325 * fVar188;
    auVar22._8_4_ = fVar331 * fVar194;
    auVar22._12_4_ = fVar333 * fVar216;
    auVar22._16_4_ = fVar335 * fVar246;
    auVar22._20_4_ = fVar337 * fVar269;
    uVar69 = local_960._28_4_;
    auVar22._24_4_ = fVar339 * fVar11;
    auVar22._28_4_ = uVar69;
    auVar184 = vsubps_avx(auVar22,auVar21);
    auVar23._4_4_ = fVar345 * fVar263;
    auVar23._0_4_ = fVar341 * fVar188;
    auVar23._8_4_ = fVar346 * fVar194;
    auVar23._12_4_ = fVar347 * fVar216;
    auVar23._16_4_ = fVar348 * fVar246;
    auVar23._20_4_ = fVar349 * fVar269;
    auVar23._24_4_ = fVar350 * fVar11;
    auVar23._28_4_ = uVar69;
    auVar24._4_4_ = fVar190 * fVar265;
    auVar24._0_4_ = fVar174 * fVar242;
    auVar24._8_4_ = fVar192 * fVar195;
    auVar24._12_4_ = fVar214 * fVar218;
    auVar24._16_4_ = fVar243 * fVar247;
    auVar24._20_4_ = fVar264 * fVar271;
    auVar24._24_4_ = fVar308 * fVar322;
    auVar24._28_4_ = local_940._28_4_;
    auVar258 = vsubps_avx(auVar24,auVar23);
    fVar143 = auVar258._28_4_;
    fVar323 = auVar184._28_4_ + fVar143;
    auVar25._4_4_ =
         (auVar229._4_4_ * auVar229._4_4_ +
         auVar168._4_4_ * auVar168._4_4_ + auVar14._4_4_ * auVar14._4_4_) * fVar248;
    auVar25._0_4_ =
         (auVar229._0_4_ * auVar229._0_4_ +
         auVar168._0_4_ * auVar168._0_4_ + auVar14._0_4_ * auVar14._0_4_) * fVar241;
    auVar25._8_4_ =
         (auVar229._8_4_ * auVar229._8_4_ +
         auVar168._8_4_ * auVar168._8_4_ + auVar14._8_4_ * auVar14._8_4_) * fVar250;
    auVar25._12_4_ =
         (auVar229._12_4_ * auVar229._12_4_ +
         auVar168._12_4_ * auVar168._12_4_ + auVar14._12_4_ * auVar14._12_4_) * fVar273;
    auVar25._16_4_ =
         (auVar229._16_4_ * auVar229._16_4_ +
         auVar168._16_4_ * auVar168._16_4_ + auVar14._16_4_ * auVar14._16_4_) * fVar275;
    auVar25._20_4_ =
         (auVar229._20_4_ * auVar229._20_4_ +
         auVar168._20_4_ * auVar168._20_4_ + auVar14._20_4_ * auVar14._20_4_) * fVar217;
    auVar25._24_4_ =
         (auVar229._24_4_ * auVar229._24_4_ +
         auVar168._24_4_ * auVar168._24_4_ + auVar14._24_4_ * auVar14._24_4_) * fVar219;
    auVar25._28_4_ = auVar229._28_4_ + auVar168._28_4_ + fVar220;
    auVar26._4_4_ =
         (auVar15._4_4_ * auVar15._4_4_ +
         auVar184._4_4_ * auVar184._4_4_ + auVar258._4_4_ * auVar258._4_4_) * fVar248;
    auVar26._0_4_ =
         (auVar15._0_4_ * auVar15._0_4_ +
         auVar184._0_4_ * auVar184._0_4_ + auVar258._0_4_ * auVar258._0_4_) * fVar241;
    auVar26._8_4_ =
         (auVar15._8_4_ * auVar15._8_4_ +
         auVar184._8_4_ * auVar184._8_4_ + auVar258._8_4_ * auVar258._8_4_) * fVar250;
    auVar26._12_4_ =
         (auVar15._12_4_ * auVar15._12_4_ +
         auVar184._12_4_ * auVar184._12_4_ + auVar258._12_4_ * auVar258._12_4_) * fVar273;
    auVar26._16_4_ =
         (auVar15._16_4_ * auVar15._16_4_ +
         auVar184._16_4_ * auVar184._16_4_ + auVar258._16_4_ * auVar258._16_4_) * fVar275;
    auVar26._20_4_ =
         (auVar15._20_4_ * auVar15._20_4_ +
         auVar184._20_4_ * auVar184._20_4_ + auVar258._20_4_ * auVar258._20_4_) * fVar217;
    auVar26._24_4_ =
         (auVar15._24_4_ * auVar15._24_4_ +
         auVar184._24_4_ * auVar184._24_4_ + auVar258._24_4_ * auVar258._24_4_) * fVar219;
    auVar26._28_4_ = auVar327._28_4_ + auVar98._28_4_;
    local_ae0 = vmaxps_avx(auVar25,auVar26);
    auVar98 = vperm2f128_avx(local_820,local_820,1);
    auVar98 = vshufps_avx(auVar98,local_820,0x30);
    local_800 = vshufps_avx(local_820,auVar98,0x29);
    local_700._0_4_ = (float)local_820._0_4_ + fVar189;
    local_700._4_4_ = local_820._4_4_ + fVar244;
    local_700._8_4_ = local_820._8_4_ + fVar268;
    local_700._12_4_ = local_820._12_4_ + fVar191;
    local_700._16_4_ = local_820._16_4_ + fVar212;
    local_700._20_4_ = local_820._20_4_ + fVar213;
    local_700._24_4_ = local_820._24_4_ + fVar221;
    local_700._28_4_ = local_820._28_4_ + auVar93._28_4_;
    auVar98 = vmaxps_avx(local_820,local_700);
    auVar184 = vmaxps_avx(_local_840,local_800);
    auVar98 = vmaxps_avx(auVar98,auVar184);
    auVar184 = vrsqrtps_avx(auVar167);
    fVar220 = auVar184._0_4_;
    fVar189 = auVar184._4_4_;
    fVar244 = auVar184._8_4_;
    fVar268 = auVar184._12_4_;
    fVar191 = auVar184._16_4_;
    fVar212 = auVar184._20_4_;
    fVar213 = auVar184._24_4_;
    local_5e0._0_4_ = fVar220 * 1.5 + fVar220 * fVar220 * fVar220 * auVar167._0_4_ * -0.5;
    local_5e0._4_4_ = fVar189 * 1.5 + fVar189 * fVar189 * fVar189 * auVar167._4_4_ * -0.5;
    local_5e0._8_4_ = fVar244 * 1.5 + fVar244 * fVar244 * fVar244 * auVar167._8_4_ * -0.5;
    local_5e0._12_4_ = fVar268 * 1.5 + fVar268 * fVar268 * fVar268 * auVar167._12_4_ * -0.5;
    local_5e0._16_4_ = fVar191 * 1.5 + fVar191 * fVar191 * fVar191 * auVar167._16_4_ * -0.5;
    local_5e0._20_4_ = fVar212 * 1.5 + fVar212 * fVar212 * fVar212 * auVar167._20_4_ * -0.5;
    local_5e0._24_4_ = fVar213 * 1.5 + fVar213 * fVar213 * fVar213 * auVar167._24_4_ * -0.5;
    local_5e0._28_4_ = auVar184._28_4_ + auVar167._28_4_;
    auVar184 = vsubps_avx(ZEXT832(0) << 0x20,local_560);
    auVar93 = vsubps_avx(ZEXT832(0) << 0x20,local_780);
    fVar189 = auVar93._0_4_;
    fVar268 = auVar93._4_4_;
    fVar212 = auVar93._8_4_;
    fVar221 = auVar93._12_4_;
    fVar248 = auVar93._16_4_;
    fVar273 = auVar93._20_4_;
    fVar217 = auVar93._24_4_;
    fVar351 = auVar184._0_4_;
    fVar353 = auVar184._4_4_;
    fVar354 = auVar184._8_4_;
    fVar355 = auVar184._12_4_;
    fVar356 = auVar184._16_4_;
    fVar357 = auVar184._20_4_;
    fVar358 = auVar184._24_4_;
    auVar66._4_4_ = fStack_a9c;
    auVar66._0_4_ = local_aa0;
    auVar66._8_4_ = fStack_a98;
    auVar66._12_4_ = fStack_a94;
    auVar66._16_4_ = fStack_a90;
    auVar66._20_4_ = fStack_a8c;
    auVar66._24_4_ = fStack_a88;
    auVar66._28_4_ = fStack_a84;
    auVar168 = ZEXT832(0) << 0x20;
    auVar184 = vsubps_avx(auVar168,auVar66);
    fVar244 = auVar184._0_4_;
    fVar191 = auVar184._4_4_;
    fVar213 = auVar184._8_4_;
    fVar241 = auVar184._12_4_;
    fVar250 = auVar184._16_4_;
    fVar275 = auVar184._20_4_;
    fVar219 = auVar184._24_4_;
    auVar303._0_4_ = local_500 * fVar244 + fVar351 * local_520 + local_540 * fVar189;
    auVar303._4_4_ = fStack_4fc * fVar191 + fVar353 * fStack_51c + fStack_53c * fVar268;
    auVar303._8_4_ = fStack_4f8 * fVar213 + fVar354 * fStack_518 + fStack_538 * fVar212;
    auVar303._12_4_ = fStack_4f4 * fVar241 + fVar355 * fStack_514 + fStack_534 * fVar221;
    auVar303._16_4_ = fStack_4f0 * fVar250 + fVar356 * fStack_510 + fStack_530 * fVar248;
    auVar303._20_4_ = fStack_4ec * fVar275 + fVar357 * fStack_50c + fStack_52c * fVar273;
    auVar303._24_4_ = fStack_4e8 * fVar219 + fVar358 * fStack_508 + fStack_528 * fVar217;
    auVar303._28_4_ = fVar323 + auVar15._28_4_ + fVar323 + 1.5;
    auVar312._0_4_ = fVar244 * fVar244 + fVar351 * fVar351 + fVar189 * fVar189;
    auVar312._4_4_ = fVar191 * fVar191 + fVar353 * fVar353 + fVar268 * fVar268;
    auVar312._8_4_ = fVar213 * fVar213 + fVar354 * fVar354 + fVar212 * fVar212;
    auVar312._12_4_ = fVar241 * fVar241 + fVar355 * fVar355 + fVar221 * fVar221;
    auVar312._16_4_ = fVar250 * fVar250 + fVar356 * fVar356 + fVar248 * fVar248;
    auVar312._20_4_ = fVar275 * fVar275 + fVar357 * fVar357 + fVar273 * fVar273;
    auVar312._24_4_ = fVar219 * fVar219 + fVar358 * fVar358 + fVar217 * fVar217;
    auVar312._28_4_ = fVar143 + fVar143 + fVar323;
    local_a00._0_4_ =
         local_500 * local_5e0._0_4_ * fVar188 +
         fVar174 * local_5e0._0_4_ * local_520 + fVar240 * local_5e0._0_4_ * local_540;
    local_a00._4_4_ =
         fStack_4fc * local_5e0._4_4_ * fVar263 +
         fVar190 * local_5e0._4_4_ * fStack_51c + fVar249 * local_5e0._4_4_ * fStack_53c;
    fStack_9f8 = fStack_4f8 * local_5e0._8_4_ * fVar194 +
                 fVar192 * local_5e0._8_4_ * fStack_518 + fVar193 * local_5e0._8_4_ * fStack_538;
    fStack_9f4 = fStack_4f4 * local_5e0._12_4_ * fVar216 +
                 fVar214 * local_5e0._12_4_ * fStack_514 + fVar215 * local_5e0._12_4_ * fStack_534;
    fStack_9f0 = fStack_4f0 * local_5e0._16_4_ * fVar246 +
                 fVar243 * local_5e0._16_4_ * fStack_510 + fVar245 * local_5e0._16_4_ * fStack_530;
    fStack_9ec = fStack_4ec * local_5e0._20_4_ * fVar269 +
                 fVar264 * local_5e0._20_4_ * fStack_50c + fVar266 * local_5e0._20_4_ * fStack_52c;
    fStack_9e8 = fStack_4e8 * local_5e0._24_4_ * fVar11 +
                 fVar308 * local_5e0._24_4_ * fStack_508 + fVar340 * local_5e0._24_4_ * fStack_528;
    fStack_9e4 = fStack_4e4 + fStack_504 + fStack_524;
    fVar220 = fStack_4e4 + fStack_504 + fStack_524;
    local_6c0._0_4_ =
         fVar244 * local_5e0._0_4_ * fVar188 +
         fVar351 * fVar174 * local_5e0._0_4_ + fVar240 * local_5e0._0_4_ * fVar189;
    local_6c0._4_4_ =
         fVar191 * local_5e0._4_4_ * fVar263 +
         fVar353 * fVar190 * local_5e0._4_4_ + fVar249 * local_5e0._4_4_ * fVar268;
    fStack_6b8 = fVar213 * local_5e0._8_4_ * fVar194 +
                 fVar354 * fVar192 * local_5e0._8_4_ + fVar193 * local_5e0._8_4_ * fVar212;
    fStack_6b4 = fVar241 * local_5e0._12_4_ * fVar216 +
                 fVar355 * fVar214 * local_5e0._12_4_ + fVar215 * local_5e0._12_4_ * fVar221;
    fStack_6b0 = fVar250 * local_5e0._16_4_ * fVar246 +
                 fVar356 * fVar243 * local_5e0._16_4_ + fVar245 * local_5e0._16_4_ * fVar248;
    fStack_6ac = fVar275 * local_5e0._20_4_ * fVar269 +
                 fVar357 * fVar264 * local_5e0._20_4_ + fVar266 * local_5e0._20_4_ * fVar273;
    fStack_6a8 = fVar219 * local_5e0._24_4_ * fVar11 +
                 fVar358 * fVar308 * local_5e0._24_4_ + fVar340 * local_5e0._24_4_ * fVar217;
    fStack_6a4 = fStack_504 + fVar220;
    auVar27._4_4_ = (float)local_6c0._4_4_ * (float)local_a00._4_4_;
    auVar27._0_4_ = (float)local_6c0._0_4_ * (float)local_a00._0_4_;
    auVar27._8_4_ = fStack_6b8 * fStack_9f8;
    auVar27._12_4_ = fStack_6b4 * fStack_9f4;
    auVar27._16_4_ = fStack_6b0 * fStack_9f0;
    auVar27._20_4_ = fStack_6ac * fStack_9ec;
    auVar27._24_4_ = fStack_6a8 * fStack_9e8;
    auVar27._28_4_ = fVar220;
    auVar229 = vsubps_avx(auVar303,auVar27);
    auVar28._4_4_ = (float)local_6c0._4_4_ * (float)local_6c0._4_4_;
    auVar28._0_4_ = (float)local_6c0._0_4_ * (float)local_6c0._0_4_;
    auVar28._8_4_ = fStack_6b8 * fStack_6b8;
    auVar28._12_4_ = fStack_6b4 * fStack_6b4;
    auVar28._16_4_ = fStack_6b0 * fStack_6b0;
    auVar28._20_4_ = fStack_6ac * fStack_6ac;
    auVar28._24_4_ = fStack_6a8 * fStack_6a8;
    auVar28._28_4_ = fStack_504;
    local_720 = vsubps_avx(auVar312,auVar28);
    local_640 = vsqrtps_avx(local_ae0);
    fVar220 = (local_640._0_4_ + auVar98._0_4_) * 1.0000002;
    fVar143 = (local_640._4_4_ + auVar98._4_4_) * 1.0000002;
    fVar323 = (local_640._8_4_ + auVar98._8_4_) * 1.0000002;
    fVar149 = (local_640._12_4_ + auVar98._12_4_) * 1.0000002;
    fVar151 = (local_640._16_4_ + auVar98._16_4_) * 1.0000002;
    fVar153 = (local_640._20_4_ + auVar98._20_4_) * 1.0000002;
    fVar155 = (local_640._24_4_ + auVar98._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar143 * fVar143;
    auVar29._0_4_ = fVar220 * fVar220;
    auVar29._8_4_ = fVar323 * fVar323;
    auVar29._12_4_ = fVar149 * fVar149;
    auVar29._16_4_ = fVar151 * fVar151;
    auVar29._20_4_ = fVar153 * fVar153;
    auVar29._24_4_ = fVar155 * fVar155;
    auVar29._28_4_ = local_640._28_4_ + auVar98._28_4_;
    fVar310 = auVar229._0_4_ + auVar229._0_4_;
    fVar316 = auVar229._4_4_ + auVar229._4_4_;
    local_5c0._0_8_ = CONCAT44(fVar316,fVar310);
    local_5c0._8_4_ = auVar229._8_4_ + auVar229._8_4_;
    local_5c0._12_4_ = auVar229._12_4_ + auVar229._12_4_;
    local_5c0._16_4_ = auVar229._16_4_ + auVar229._16_4_;
    local_5c0._20_4_ = auVar229._20_4_ + auVar229._20_4_;
    local_5c0._24_4_ = auVar229._24_4_ + auVar229._24_4_;
    fVar220 = auVar229._28_4_;
    local_5c0._28_4_ = fVar220 + fVar220;
    auVar98 = vsubps_avx(local_720,auVar29);
    local_5a0._4_4_ = (float)local_a00._4_4_ * (float)local_a00._4_4_;
    local_5a0._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    local_5a0._8_4_ = fStack_9f8 * fStack_9f8;
    local_5a0._12_4_ = fStack_9f4 * fStack_9f4;
    local_5a0._16_4_ = fStack_9f0 * fStack_9f0;
    local_5a0._20_4_ = fStack_9ec * fStack_9ec;
    local_5a0._24_4_ = fStack_9e8 * fStack_9e8;
    local_5a0._28_4_ = local_780._28_4_;
    local_6a0 = vsubps_avx(local_2a0,local_5a0);
    local_740._4_4_ = fVar316 * fVar316;
    local_740._0_4_ = fVar310 * fVar310;
    fStack_738 = local_5c0._8_4_ * local_5c0._8_4_;
    fStack_734 = local_5c0._12_4_ * local_5c0._12_4_;
    fStack_730 = local_5c0._16_4_ * local_5c0._16_4_;
    fStack_72c = local_5c0._20_4_ * local_5c0._20_4_;
    fStack_728 = local_5c0._24_4_ * local_5c0._24_4_;
    fStack_724 = fVar220;
    fVar143 = local_6a0._0_4_;
    local_760._0_4_ = fVar143 * 4.0;
    fVar323 = local_6a0._4_4_;
    local_760._4_4_ = fVar323 * 4.0;
    fVar149 = local_6a0._8_4_;
    fStack_758 = fVar149 * 4.0;
    fVar151 = local_6a0._12_4_;
    fStack_754 = fVar151 * 4.0;
    fVar153 = local_6a0._16_4_;
    fStack_750 = fVar153 * 4.0;
    fVar155 = local_6a0._20_4_;
    fStack_74c = fVar155 * 4.0;
    fVar301 = local_6a0._24_4_;
    fStack_748 = fVar301 * 4.0;
    uStack_744 = 0x40800000;
    auVar30._4_4_ = auVar98._4_4_ * (float)local_760._4_4_;
    auVar30._0_4_ = auVar98._0_4_ * (float)local_760._0_4_;
    auVar30._8_4_ = auVar98._8_4_ * fStack_758;
    auVar30._12_4_ = auVar98._12_4_ * fStack_754;
    auVar30._16_4_ = auVar98._16_4_ * fStack_750;
    auVar30._20_4_ = auVar98._20_4_ * fStack_74c;
    auVar30._24_4_ = auVar98._24_4_ * fStack_748;
    auVar30._28_4_ = 0x40800000;
    auVar229 = vsubps_avx(_local_740,auVar30);
    local_ae0 = vcmpps_avx(auVar229,auVar168,5);
    fVar220 = local_6a0._28_4_;
    if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_ae0 >> 0x7f,0) == '\0') &&
          (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_ae0 >> 0xbf,0) == '\0') &&
        (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_ae0[0x1f]) {
      auVar124._8_4_ = 0x7f800000;
      auVar124._0_8_ = 0x7f8000007f800000;
      auVar124._12_4_ = 0x7f800000;
      auVar124._16_4_ = 0x7f800000;
      auVar124._20_4_ = 0x7f800000;
      auVar124._24_4_ = 0x7f800000;
      auVar124._28_4_ = 0x7f800000;
      auVar313._8_4_ = 0xff800000;
      auVar313._0_8_ = 0xff800000ff800000;
      auVar313._12_4_ = 0xff800000;
      auVar313._16_4_ = 0xff800000;
      auVar313._20_4_ = 0xff800000;
      auVar313._24_4_ = 0xff800000;
      auVar313._28_4_ = 0xff800000;
      fVar310 = 0.0;
    }
    else {
      auVar327 = vsqrtps_avx(auVar229);
      auVar255._0_4_ = fVar143 + fVar143;
      auVar255._4_4_ = fVar323 + fVar323;
      auVar255._8_4_ = fVar149 + fVar149;
      auVar255._12_4_ = fVar151 + fVar151;
      auVar255._16_4_ = fVar153 + fVar153;
      auVar255._20_4_ = fVar155 + fVar155;
      auVar255._24_4_ = fVar301 + fVar301;
      auVar255._28_4_ = fVar220 + fVar220;
      auVar14 = vrcpps_avx(auVar255);
      auVar168 = vcmpps_avx(auVar229,auVar168,5);
      fVar107 = auVar14._0_4_;
      fVar144 = auVar14._4_4_;
      auVar31._4_4_ = auVar255._4_4_ * fVar144;
      auVar31._0_4_ = auVar255._0_4_ * fVar107;
      fVar146 = auVar14._8_4_;
      auVar31._8_4_ = auVar255._8_4_ * fVar146;
      fVar150 = auVar14._12_4_;
      auVar31._12_4_ = auVar255._12_4_ * fVar150;
      fVar152 = auVar14._16_4_;
      auVar31._16_4_ = auVar255._16_4_ * fVar152;
      fVar154 = auVar14._20_4_;
      auVar31._20_4_ = auVar255._20_4_ * fVar154;
      fVar156 = auVar14._24_4_;
      auVar31._24_4_ = auVar255._24_4_ * fVar156;
      auVar31._28_4_ = auVar229._28_4_;
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = &DAT_3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar94._16_4_ = 0x3f800000;
      auVar94._20_4_ = 0x3f800000;
      auVar94._24_4_ = 0x3f800000;
      auVar94._28_4_ = 0x3f800000;
      auVar229 = vsubps_avx(auVar94,auVar31);
      fVar107 = fVar107 + fVar107 * auVar229._0_4_;
      fVar144 = fVar144 + fVar144 * auVar229._4_4_;
      fVar146 = fVar146 + fVar146 * auVar229._8_4_;
      fVar150 = fVar150 + fVar150 * auVar229._12_4_;
      fVar152 = fVar152 + fVar152 * auVar229._16_4_;
      fVar154 = fVar154 + fVar154 * auVar229._20_4_;
      fVar156 = fVar156 + fVar156 * auVar229._24_4_;
      auVar256._0_8_ = CONCAT44(fVar316,fVar310) ^ 0x8000000080000000;
      auVar256._8_4_ = -local_5c0._8_4_;
      auVar256._12_4_ = -local_5c0._12_4_;
      auVar256._16_4_ = -local_5c0._16_4_;
      auVar256._20_4_ = -local_5c0._20_4_;
      auVar256._24_4_ = -local_5c0._24_4_;
      auVar256._28_4_ = -local_5c0._28_4_;
      auVar15 = vsubps_avx(auVar256,auVar327);
      fVar310 = auVar15._0_4_ * fVar107;
      fVar316 = auVar15._4_4_ * fVar144;
      auVar32._4_4_ = fVar316;
      auVar32._0_4_ = fVar310;
      fVar267 = auVar15._8_4_ * fVar146;
      auVar32._8_4_ = fVar267;
      fVar270 = auVar15._12_4_ * fVar150;
      auVar32._12_4_ = fVar270;
      fVar272 = auVar15._16_4_ * fVar152;
      auVar32._16_4_ = fVar272;
      fVar274 = auVar15._20_4_ * fVar154;
      auVar32._20_4_ = fVar274;
      fVar276 = auVar15._24_4_ * fVar156;
      auVar32._24_4_ = fVar276;
      auVar32._28_4_ = auVar15._28_4_;
      auVar327 = vsubps_avx(auVar327,local_5c0);
      fVar107 = auVar327._0_4_ * fVar107;
      fVar144 = auVar327._4_4_ * fVar144;
      auVar33._4_4_ = fVar144;
      auVar33._0_4_ = fVar107;
      fVar146 = auVar327._8_4_ * fVar146;
      auVar33._8_4_ = fVar146;
      fVar150 = auVar327._12_4_ * fVar150;
      auVar33._12_4_ = fVar150;
      fVar152 = auVar327._16_4_ * fVar152;
      auVar33._16_4_ = fVar152;
      fVar154 = auVar327._20_4_ * fVar154;
      auVar33._20_4_ = fVar154;
      fVar156 = auVar327._24_4_ * fVar156;
      auVar33._24_4_ = fVar156;
      auVar33._28_4_ = auVar327._28_4_;
      fStack_4a4 = fStack_6a4 + auVar14._28_4_ + auVar229._28_4_;
      local_4c0[0] = local_5e0._0_4_ * ((float)local_6c0._0_4_ + (float)local_a00._0_4_ * fVar310);
      local_4c0[1] = local_5e0._4_4_ * ((float)local_6c0._4_4_ + (float)local_a00._4_4_ * fVar316);
      local_4c0[2] = local_5e0._8_4_ * (fStack_6b8 + fStack_9f8 * fVar267);
      local_4c0[3] = local_5e0._12_4_ * (fStack_6b4 + fStack_9f4 * fVar270);
      fStack_4b0 = local_5e0._16_4_ * (fStack_6b0 + fStack_9f0 * fVar272);
      fStack_4ac = local_5e0._20_4_ * (fStack_6ac + fStack_9ec * fVar274);
      fStack_4a8 = local_5e0._24_4_ * (fStack_6a8 + fStack_9e8 * fVar276);
      local_4e0[0] = local_5e0._0_4_ * ((float)local_6c0._0_4_ + (float)local_a00._0_4_ * fVar107);
      local_4e0[1] = local_5e0._4_4_ * ((float)local_6c0._4_4_ + (float)local_a00._4_4_ * fVar144);
      local_4e0[2] = local_5e0._8_4_ * (fStack_6b8 + fStack_9f8 * fVar146);
      local_4e0[3] = local_5e0._12_4_ * (fStack_6b4 + fStack_9f4 * fVar150);
      fStack_4d0 = local_5e0._16_4_ * (fStack_6b0 + fStack_9f0 * fVar152);
      fStack_4cc = local_5e0._20_4_ * (fStack_6ac + fStack_9ec * fVar154);
      fStack_4c8 = local_5e0._24_4_ * (fStack_6a8 + fStack_9e8 * fVar156);
      fStack_4c4 = fStack_6a4 + fStack_4a4;
      auVar125._8_4_ = 0x7f800000;
      auVar125._0_8_ = 0x7f8000007f800000;
      auVar125._12_4_ = 0x7f800000;
      auVar125._16_4_ = 0x7f800000;
      auVar125._20_4_ = 0x7f800000;
      auVar125._24_4_ = 0x7f800000;
      auVar125._28_4_ = 0x7f800000;
      auVar124 = vblendvps_avx(auVar125,auVar32,auVar168);
      auVar282._8_4_ = 0x7fffffff;
      auVar282._0_8_ = 0x7fffffff7fffffff;
      auVar282._12_4_ = 0x7fffffff;
      auVar282._16_4_ = 0x7fffffff;
      auVar282._20_4_ = 0x7fffffff;
      auVar282._24_4_ = 0x7fffffff;
      auVar282._28_4_ = 0x7fffffff;
      auVar229 = vandps_avx(local_5a0,auVar282);
      auVar229 = vmaxps_avx(local_3e0,auVar229);
      auVar34._4_4_ = auVar229._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar229._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar229._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar229._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar229._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar229._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar229._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar229._28_4_;
      auVar229 = vandps_avx(local_6a0,auVar282);
      auVar229 = vcmpps_avx(auVar229,auVar34,1);
      auVar257._8_4_ = 0xff800000;
      auVar257._0_8_ = 0xff800000ff800000;
      auVar257._12_4_ = 0xff800000;
      auVar257._16_4_ = 0xff800000;
      auVar257._20_4_ = 0xff800000;
      auVar257._24_4_ = 0xff800000;
      auVar257._28_4_ = 0xff800000;
      auVar313 = vblendvps_avx(auVar257,auVar33,auVar168);
      auVar14 = auVar168 & auVar229;
      fVar310 = fStack_6a4;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar229 = vandps_avx(auVar229,auVar168);
        auVar115 = vpackssdw_avx(auVar229._0_16_,auVar229._16_16_);
        auVar14 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,2);
        auVar102._8_4_ = 0xff800000;
        auVar102._0_8_ = 0xff800000ff800000;
        auVar102._12_4_ = 0xff800000;
        auVar102._16_4_ = 0xff800000;
        auVar102._20_4_ = 0xff800000;
        auVar102._24_4_ = 0xff800000;
        auVar102._28_4_ = 0xff800000;
        auVar295._8_4_ = 0x7f800000;
        auVar295._0_8_ = 0x7f8000007f800000;
        auVar295._12_4_ = 0x7f800000;
        auVar295._16_4_ = 0x7f800000;
        auVar295._20_4_ = 0x7f800000;
        auVar295._24_4_ = 0x7f800000;
        auVar295._28_4_ = 0x7f800000;
        auVar98 = vblendvps_avx(auVar295,auVar102,auVar14);
        auVar83 = vpmovsxwd_avx(auVar115);
        auVar115 = vpunpckhwd_avx(auVar115,auVar115);
        auVar261._16_16_ = auVar115;
        auVar261._0_16_ = auVar83;
        auVar124 = vblendvps_avx(auVar124,auVar98,auVar261);
        auVar98 = vblendvps_avx(auVar102,auVar295,auVar14);
        auVar313 = vblendvps_avx(auVar313,auVar98,auVar261);
        auVar98 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar239._0_4_ = auVar229._0_4_ ^ auVar98._0_4_;
        auVar239._4_4_ = auVar229._4_4_ ^ auVar98._4_4_;
        auVar239._8_4_ = auVar229._8_4_ ^ auVar98._8_4_;
        auVar239._12_4_ = auVar229._12_4_ ^ auVar98._12_4_;
        auVar239._16_4_ = auVar229._16_4_ ^ auVar98._16_4_;
        auVar239._20_4_ = auVar229._20_4_ ^ auVar98._20_4_;
        auVar239._24_4_ = auVar229._24_4_ ^ auVar98._24_4_;
        auVar239._28_4_ = auVar229._28_4_ ^ auVar98._28_4_;
        auVar98 = vorps_avx(auVar14,auVar239);
        local_ae0 = vandps_avx(auVar168,auVar98);
      }
    }
    auVar98 = local_3c0 & local_ae0;
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = &DAT_3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar229._16_4_ = 0x3f800000;
    auVar229._20_4_ = 0x3f800000;
    auVar229._24_4_ = 0x3f800000;
    auVar229._28_4_ = 0x3f800000;
    auVar306 = local_5e0;
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0x7f,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar98 >> 0xbf,0) == '\0') &&
        (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f]) {
LAB_00f18327:
      auVar307 = ZEXT3264(auVar306);
      auVar262 = ZEXT3264(_local_8a0);
    }
    else {
      auVar115 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7c0._0_4_));
      auVar115 = vshufps_avx(auVar115,auVar115,0);
      auVar231._16_16_ = auVar115;
      auVar231._0_16_ = auVar115;
      _local_7a0 = vmaxps_avx(auVar231,auVar124);
      auVar115 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7c0._0_4_));
      auVar115 = vshufps_avx(auVar115,auVar115,0);
      auVar232._16_16_ = auVar115;
      auVar232._0_16_ = auVar115;
      auVar168 = vminps_avx(auVar232,auVar313);
      fVar156 = auVar93._28_4_;
      auVar95._0_4_ = local_500 * fVar277 + local_520 * fVar309 + fVar324 * local_540;
      auVar95._4_4_ = fStack_4fc * fVar286 + fStack_51c * fVar315 + fVar328 * fStack_53c;
      auVar95._8_4_ = fStack_4f8 * fVar287 + fStack_518 * fVar317 + fVar330 * fStack_538;
      auVar95._12_4_ = fStack_4f4 * fVar288 + fStack_514 * fVar318 + fVar332 * fStack_534;
      auVar95._16_4_ = fStack_4f0 * fVar289 + fStack_510 * fVar319 + fVar334 * fStack_530;
      auVar95._20_4_ = fStack_4ec * fVar290 + fStack_50c * fVar320 + fVar336 * fStack_52c;
      auVar95._24_4_ = fStack_4e8 * fVar291 + fStack_508 * fVar321 + fVar338 * fStack_528;
      auVar95._28_4_ = auVar281._28_4_ + auVar184._28_4_ + fVar156;
      auVar98 = vrcpps_avx(auVar95);
      fVar316 = auVar98._0_4_;
      fVar107 = auVar98._4_4_;
      auVar35._4_4_ = auVar95._4_4_ * fVar107;
      auVar35._0_4_ = auVar95._0_4_ * fVar316;
      fVar144 = auVar98._8_4_;
      auVar35._8_4_ = auVar95._8_4_ * fVar144;
      fVar146 = auVar98._12_4_;
      auVar35._12_4_ = auVar95._12_4_ * fVar146;
      fVar150 = auVar98._16_4_;
      auVar35._16_4_ = auVar95._16_4_ * fVar150;
      fVar152 = auVar98._20_4_;
      auVar35._20_4_ = auVar95._20_4_ * fVar152;
      fVar154 = auVar98._24_4_;
      auVar35._24_4_ = auVar95._24_4_ * fVar154;
      auVar35._28_4_ = auVar184._28_4_;
      auVar184 = vsubps_avx(auVar229,auVar35);
      auVar294._8_4_ = 0x7fffffff;
      auVar294._0_8_ = 0x7fffffff7fffffff;
      auVar294._12_4_ = 0x7fffffff;
      auVar294._16_4_ = 0x7fffffff;
      auVar294._20_4_ = 0x7fffffff;
      auVar294._24_4_ = 0x7fffffff;
      auVar294._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar294,auVar95);
      auVar314._8_4_ = 0x219392ef;
      auVar314._0_8_ = 0x219392ef219392ef;
      auVar314._12_4_ = 0x219392ef;
      auVar314._16_4_ = 0x219392ef;
      auVar314._20_4_ = 0x219392ef;
      auVar314._24_4_ = 0x219392ef;
      auVar314._28_4_ = 0x219392ef;
      auVar98 = vcmpps_avx(auVar98,auVar314,1);
      auVar306._8_4_ = 0x80000000;
      auVar306._0_8_ = 0x8000000080000000;
      auVar306._12_4_ = 0x80000000;
      auVar306._16_4_ = 0x80000000;
      auVar306._20_4_ = 0x80000000;
      auVar306._24_4_ = 0x80000000;
      auVar306._28_4_ = 0x80000000;
      auVar36._4_4_ =
           (fVar107 + fVar107 * auVar184._4_4_) *
           -(fVar191 * fVar286 + fVar353 * fVar315 + fVar328 * fVar268);
      auVar36._0_4_ =
           (fVar316 + fVar316 * auVar184._0_4_) *
           -(fVar244 * fVar277 + fVar351 * fVar309 + fVar324 * fVar189);
      auVar36._8_4_ =
           (fVar144 + fVar144 * auVar184._8_4_) *
           -(fVar213 * fVar287 + fVar354 * fVar317 + fVar330 * fVar212);
      auVar36._12_4_ =
           (fVar146 + fVar146 * auVar184._12_4_) *
           -(fVar241 * fVar288 + fVar355 * fVar318 + fVar332 * fVar221);
      auVar36._16_4_ =
           (fVar150 + fVar150 * auVar184._16_4_) *
           -(fVar250 * fVar289 + fVar356 * fVar319 + fVar334 * fVar248);
      auVar36._20_4_ =
           (fVar152 + fVar152 * auVar184._20_4_) *
           -(fVar275 * fVar290 + fVar357 * fVar320 + fVar336 * fVar273);
      auVar36._24_4_ =
           (fVar154 + fVar154 * auVar184._24_4_) *
           -(fVar219 * fVar291 + fVar358 * fVar321 + fVar338 * fVar217);
      auVar36._28_4_ = -(fVar156 + fVar310 + fVar156);
      auVar184 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,1);
      auVar93 = vorps_avx(auVar98,auVar184);
      auVar184 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,6);
      auVar184 = vorps_avx(auVar98,auVar184);
      auVar300._8_4_ = 0xff800000;
      auVar300._0_8_ = 0xff800000ff800000;
      auVar300._12_4_ = 0xff800000;
      auVar300._16_4_ = 0xff800000;
      auVar300._20_4_ = 0xff800000;
      auVar300._24_4_ = 0xff800000;
      auVar300._28_4_ = 0xff800000;
      auVar98 = vblendvps_avx(auVar36,auVar300,auVar93);
      auVar304._8_4_ = 0x7f800000;
      auVar304._0_8_ = 0x7f8000007f800000;
      auVar304._12_4_ = 0x7f800000;
      auVar304._16_4_ = 0x7f800000;
      auVar304._20_4_ = 0x7f800000;
      auVar304._24_4_ = 0x7f800000;
      auVar304._28_4_ = 0x7f800000;
      auVar184 = vblendvps_avx(auVar36,auVar304,auVar184);
      auVar93 = vmaxps_avx(_local_7a0,auVar98);
      auVar168 = vminps_avx(auVar168,auVar184);
      auVar258 = ZEXT832(0) << 0x20;
      auVar98 = vsubps_avx(auVar258,local_a80);
      auVar184 = vsubps_avx(auVar258,_local_980);
      auVar37._4_4_ = auVar184._4_4_ * -fVar329;
      auVar37._0_4_ = auVar184._0_4_ * -fVar325;
      auVar37._8_4_ = auVar184._8_4_ * -fVar331;
      auVar37._12_4_ = auVar184._12_4_ * -fVar333;
      auVar37._16_4_ = auVar184._16_4_ * -fVar335;
      auVar37._20_4_ = auVar184._20_4_ * -fVar337;
      auVar37._24_4_ = auVar184._24_4_ * -fVar339;
      auVar37._28_4_ = auVar184._28_4_;
      auVar38._4_4_ = fVar345 * auVar98._4_4_;
      auVar38._0_4_ = fVar341 * auVar98._0_4_;
      auVar38._8_4_ = fVar346 * auVar98._8_4_;
      auVar38._12_4_ = fVar347 * auVar98._12_4_;
      auVar38._16_4_ = fVar348 * auVar98._16_4_;
      auVar38._20_4_ = fVar349 * auVar98._20_4_;
      auVar38._24_4_ = fVar350 * auVar98._24_4_;
      auVar38._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(auVar37,auVar38);
      auVar184 = vsubps_avx(auVar258,local_6e0);
      auVar39._4_4_ = fVar265 * auVar184._4_4_;
      auVar39._0_4_ = fVar242 * auVar184._0_4_;
      auVar39._8_4_ = fVar195 * auVar184._8_4_;
      auVar39._12_4_ = fVar218 * auVar184._12_4_;
      auVar39._16_4_ = fVar247 * auVar184._16_4_;
      auVar39._20_4_ = fVar271 * auVar184._20_4_;
      uVar2 = auVar184._28_4_;
      auVar39._24_4_ = fVar322 * auVar184._24_4_;
      auVar39._28_4_ = uVar2;
      auVar14 = vsubps_avx(auVar98,auVar39);
      auVar40._4_4_ = fStack_53c * -fVar329;
      auVar40._0_4_ = local_540 * -fVar325;
      auVar40._8_4_ = fStack_538 * -fVar331;
      auVar40._12_4_ = fStack_534 * -fVar333;
      auVar40._16_4_ = fStack_530 * -fVar335;
      auVar40._20_4_ = fStack_52c * -fVar337;
      auVar40._24_4_ = fStack_528 * -fVar339;
      auVar40._28_4_ = uVar69 ^ 0x80000000;
      auVar41._4_4_ = fStack_51c * fVar345;
      auVar41._0_4_ = local_520 * fVar341;
      auVar41._8_4_ = fStack_518 * fVar346;
      auVar41._12_4_ = fStack_514 * fVar347;
      auVar41._16_4_ = fStack_510 * fVar348;
      auVar41._20_4_ = fStack_50c * fVar349;
      auVar41._24_4_ = fStack_508 * fVar350;
      auVar41._28_4_ = uVar2;
      auVar229._8_4_ = 0x3f800000;
      auVar229._0_8_ = &DAT_3f8000003f800000;
      auVar229._12_4_ = 0x3f800000;
      auVar229._16_4_ = 0x3f800000;
      auVar229._20_4_ = 0x3f800000;
      auVar229._24_4_ = 0x3f800000;
      auVar229._28_4_ = 0x3f800000;
      auVar98 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fStack_4fc * fVar265;
      auVar42._0_4_ = local_500 * fVar242;
      auVar42._8_4_ = fStack_4f8 * fVar195;
      auVar42._12_4_ = fStack_4f4 * fVar218;
      auVar42._16_4_ = fStack_4f0 * fVar247;
      auVar42._20_4_ = fStack_4ec * fVar271;
      auVar42._24_4_ = fStack_4e8 * fVar322;
      auVar42._28_4_ = uVar2;
      auVar327 = vsubps_avx(auVar98,auVar42);
      auVar98 = vrcpps_avx(auVar327);
      fVar242 = auVar98._0_4_;
      fVar189 = auVar98._4_4_;
      auVar43._4_4_ = auVar327._4_4_ * fVar189;
      auVar43._0_4_ = auVar327._0_4_ * fVar242;
      fVar244 = auVar98._8_4_;
      auVar43._8_4_ = auVar327._8_4_ * fVar244;
      fVar265 = auVar98._12_4_;
      auVar43._12_4_ = auVar327._12_4_ * fVar265;
      fVar268 = auVar98._16_4_;
      auVar43._16_4_ = auVar327._16_4_ * fVar268;
      fVar191 = auVar98._20_4_;
      auVar43._20_4_ = auVar327._20_4_ * fVar191;
      fVar195 = auVar98._24_4_;
      auVar43._24_4_ = auVar327._24_4_ * fVar195;
      auVar43._28_4_ = local_940._28_4_;
      auVar15 = vsubps_avx(auVar229,auVar43);
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      auVar126._16_4_ = 0x7fffffff;
      auVar126._20_4_ = 0x7fffffff;
      auVar126._24_4_ = 0x7fffffff;
      auVar126._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar327,auVar126);
      auVar184 = vcmpps_avx(auVar98,auVar314,1);
      auVar44._4_4_ = (fVar189 + fVar189 * auVar15._4_4_) * -auVar14._4_4_;
      auVar44._0_4_ = (fVar242 + fVar242 * auVar15._0_4_) * -auVar14._0_4_;
      auVar44._8_4_ = (fVar244 + fVar244 * auVar15._8_4_) * -auVar14._8_4_;
      auVar44._12_4_ = (fVar265 + fVar265 * auVar15._12_4_) * -auVar14._12_4_;
      auVar44._16_4_ = (fVar268 + fVar268 * auVar15._16_4_) * -auVar14._16_4_;
      auVar44._20_4_ = (fVar191 + fVar191 * auVar15._20_4_) * -auVar14._20_4_;
      auVar44._24_4_ = (fVar195 + fVar195 * auVar15._24_4_) * -auVar14._24_4_;
      auVar44._28_4_ = auVar14._28_4_ ^ 0x80000000;
      auVar98 = vcmpps_avx(auVar327,auVar258,1);
      auVar98 = vorps_avx(auVar184,auVar98);
      auVar98 = vblendvps_avx(auVar44,auVar300,auVar98);
      _local_7a0 = vmaxps_avx(auVar93,auVar98);
      auVar98 = vcmpps_avx(auVar327,ZEXT832(0) << 0x20,6);
      auVar98 = vorps_avx(auVar184,auVar98);
      auVar184 = vblendvps_avx(auVar44,auVar304,auVar98);
      auVar98 = vandps_avx(local_3c0,local_ae0);
      local_460 = vminps_avx(auVar168,auVar184);
      auVar184 = vcmpps_avx(_local_7a0,local_460,2);
      auVar93 = auVar98 & auVar184;
      if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar93 >> 0x7f,0) == '\0') &&
            (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar93 >> 0xbf,0) == '\0') &&
          (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f])
      goto LAB_00f18327;
      auVar14 = _local_7a0;
      auVar93 = vminps_avx(local_820,local_700);
      auVar168 = vminps_avx(_local_840,local_800);
      auVar93 = vminps_avx(auVar93,auVar168);
      auVar93 = vsubps_avx(auVar93,local_640);
      auVar98 = vandps_avx(auVar184,auVar98);
      auVar68._4_4_ = local_4c0[1];
      auVar68._0_4_ = local_4c0[0];
      auVar68._8_4_ = local_4c0[2];
      auVar68._12_4_ = local_4c0[3];
      auVar68._16_4_ = fStack_4b0;
      auVar68._20_4_ = fStack_4ac;
      auVar68._24_4_ = fStack_4a8;
      auVar68._28_4_ = fStack_4a4;
      auVar184 = vminps_avx(auVar68,auVar229);
      auVar184 = vmaxps_avx(auVar184,ZEXT832(0) << 0x20);
      local_4c0[0] = fVar76 + fVar106 * (auVar184._0_4_ + 0.0) * 0.125;
      local_4c0[1] = fVar103 + fVar142 * (auVar184._4_4_ + 1.0) * 0.125;
      local_4c0[2] = fVar104 + fVar145 * (auVar184._8_4_ + 2.0) * 0.125;
      local_4c0[3] = fVar105 + fVar148 * (auVar184._12_4_ + 3.0) * 0.125;
      fStack_4b0 = fVar76 + fVar106 * (auVar184._16_4_ + 4.0) * 0.125;
      fStack_4ac = fVar103 + fVar142 * (auVar184._20_4_ + 5.0) * 0.125;
      fStack_4a8 = fVar104 + fVar145 * (auVar184._24_4_ + 6.0) * 0.125;
      fStack_4a4 = fVar105 + auVar184._28_4_ + 7.0;
      auVar67._4_4_ = local_4e0[1];
      auVar67._0_4_ = local_4e0[0];
      auVar67._8_4_ = local_4e0[2];
      auVar67._12_4_ = local_4e0[3];
      auVar67._16_4_ = fStack_4d0;
      auVar67._20_4_ = fStack_4cc;
      auVar67._24_4_ = fStack_4c8;
      auVar67._28_4_ = fStack_4c4;
      auVar184 = vminps_avx(auVar67,auVar229);
      auVar184 = vmaxps_avx(auVar184,ZEXT832(0) << 0x20);
      local_4e0[0] = fVar76 + fVar106 * (auVar184._0_4_ + 0.0) * 0.125;
      local_4e0[1] = fVar103 + fVar142 * (auVar184._4_4_ + 1.0) * 0.125;
      local_4e0[2] = fVar104 + fVar145 * (auVar184._8_4_ + 2.0) * 0.125;
      local_4e0[3] = fVar105 + fVar148 * (auVar184._12_4_ + 3.0) * 0.125;
      fStack_4d0 = fVar76 + fVar106 * (auVar184._16_4_ + 4.0) * 0.125;
      fStack_4cc = fVar103 + fVar142 * (auVar184._20_4_ + 5.0) * 0.125;
      fStack_4c8 = fVar104 + fVar145 * (auVar184._24_4_ + 6.0) * 0.125;
      fStack_4c4 = fVar105 + auVar184._28_4_ + 7.0;
      auVar46._4_4_ = auVar93._4_4_ * 0.99999976;
      auVar46._0_4_ = auVar93._0_4_ * 0.99999976;
      auVar46._8_4_ = auVar93._8_4_ * 0.99999976;
      auVar46._12_4_ = auVar93._12_4_ * 0.99999976;
      auVar46._16_4_ = auVar93._16_4_ * 0.99999976;
      auVar46._20_4_ = auVar93._20_4_ * 0.99999976;
      auVar46._24_4_ = auVar93._24_4_ * 0.99999976;
      auVar46._28_4_ = 0x3f7ffffc;
      auVar184 = vmaxps_avx(ZEXT832(0) << 0x20,auVar46);
      auVar47._4_4_ = auVar184._4_4_ * auVar184._4_4_;
      auVar47._0_4_ = auVar184._0_4_ * auVar184._0_4_;
      auVar47._8_4_ = auVar184._8_4_ * auVar184._8_4_;
      auVar47._12_4_ = auVar184._12_4_ * auVar184._12_4_;
      auVar47._16_4_ = auVar184._16_4_ * auVar184._16_4_;
      auVar47._20_4_ = auVar184._20_4_ * auVar184._20_4_;
      auVar47._24_4_ = auVar184._24_4_ * auVar184._24_4_;
      auVar47._28_4_ = auVar184._28_4_;
      auVar93 = vsubps_avx(local_720,auVar47);
      auVar48._4_4_ = auVar93._4_4_ * (float)local_760._4_4_;
      auVar48._0_4_ = auVar93._0_4_ * (float)local_760._0_4_;
      auVar48._8_4_ = auVar93._8_4_ * fStack_758;
      auVar48._12_4_ = auVar93._12_4_ * fStack_754;
      auVar48._16_4_ = auVar93._16_4_ * fStack_750;
      auVar48._20_4_ = auVar93._20_4_ * fStack_74c;
      auVar48._24_4_ = auVar93._24_4_ * fStack_748;
      auVar48._28_4_ = auVar184._28_4_;
      auVar168 = vsubps_avx(_local_740,auVar48);
      _local_400 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar184 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,5);
      if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar184 >> 0x7f,0) == '\0') &&
            (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar184 >> 0xbf,0) == '\0') &&
          (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar184[0x1f]) {
        _local_660 = _local_400;
        _local_680 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar183 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar207 = ZEXT828(0) << 0x20;
        auVar298 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar128._8_4_ = 0x7f800000;
        auVar128._0_8_ = 0x7f8000007f800000;
        auVar128._12_4_ = 0x7f800000;
        auVar128._16_4_ = 0x7f800000;
        auVar128._20_4_ = 0x7f800000;
        auVar128._24_4_ = 0x7f800000;
        auVar128._28_4_ = 0x7f800000;
        auVar233._8_4_ = 0xff800000;
        auVar233._0_8_ = 0xff800000ff800000;
        auVar233._12_4_ = 0xff800000;
        auVar233._16_4_ = 0xff800000;
        auVar233._20_4_ = 0xff800000;
        auVar233._24_4_ = 0xff800000;
        auVar233._28_4_ = 0xff800000;
      }
      else {
        local_9e0 = auVar93;
        local_860 = auVar184;
        local_ae0 = auVar98;
        auVar15 = vsqrtps_avx(auVar168);
        auVar129._0_4_ = fVar143 + fVar143;
        auVar129._4_4_ = fVar323 + fVar323;
        auVar129._8_4_ = fVar149 + fVar149;
        auVar129._12_4_ = fVar151 + fVar151;
        auVar129._16_4_ = fVar153 + fVar153;
        auVar129._20_4_ = fVar155 + fVar155;
        auVar129._24_4_ = fVar301 + fVar301;
        auVar129._28_4_ = fVar220 + fVar220;
        auVar327 = vrcpps_avx(auVar129);
        fVar220 = auVar327._0_4_;
        fVar242 = auVar327._4_4_;
        auVar49._4_4_ = auVar129._4_4_ * fVar242;
        auVar49._0_4_ = auVar129._0_4_ * fVar220;
        fVar189 = auVar327._8_4_;
        auVar49._8_4_ = auVar129._8_4_ * fVar189;
        fVar244 = auVar327._12_4_;
        auVar49._12_4_ = auVar129._12_4_ * fVar244;
        fVar265 = auVar327._16_4_;
        auVar49._16_4_ = auVar129._16_4_ * fVar265;
        fVar268 = auVar327._20_4_;
        auVar49._20_4_ = auVar129._20_4_ * fVar268;
        fVar191 = auVar327._24_4_;
        auVar49._24_4_ = auVar129._24_4_ * fVar191;
        auVar49._28_4_ = auVar129._28_4_;
        auVar229 = vsubps_avx(auVar229,auVar49);
        fVar220 = fVar220 + fVar220 * auVar229._0_4_;
        fVar242 = fVar242 + fVar242 * auVar229._4_4_;
        fVar189 = fVar189 + fVar189 * auVar229._8_4_;
        fVar244 = fVar244 + fVar244 * auVar229._12_4_;
        fVar265 = fVar265 + fVar265 * auVar229._16_4_;
        fVar268 = fVar268 + fVar268 * auVar229._20_4_;
        fVar191 = fVar191 + fVar191 * auVar229._24_4_;
        fVar248 = auVar327._28_4_ + auVar229._28_4_;
        auVar130._0_8_ = local_5c0._0_8_ ^ 0x8000000080000000;
        auVar130._8_4_ = -local_5c0._8_4_;
        auVar130._12_4_ = -local_5c0._12_4_;
        auVar130._16_4_ = -local_5c0._16_4_;
        auVar130._20_4_ = -local_5c0._20_4_;
        auVar130._24_4_ = -local_5c0._24_4_;
        auVar130._28_4_ = -local_5c0._28_4_;
        auVar229 = vsubps_avx(auVar130,auVar15);
        fVar195 = auVar229._0_4_ * fVar220;
        fVar212 = auVar229._4_4_ * fVar242;
        auVar50._4_4_ = fVar212;
        auVar50._0_4_ = fVar195;
        fVar213 = auVar229._8_4_ * fVar189;
        auVar50._8_4_ = fVar213;
        fVar218 = auVar229._12_4_ * fVar244;
        auVar50._12_4_ = fVar218;
        fVar221 = auVar229._16_4_ * fVar265;
        auVar50._16_4_ = fVar221;
        fVar241 = auVar229._20_4_ * fVar268;
        auVar50._20_4_ = fVar241;
        fVar247 = auVar229._24_4_ * fVar191;
        auVar50._24_4_ = fVar247;
        auVar50._28_4_ = auVar229._28_4_;
        auVar229 = vsubps_avx(auVar15,local_5c0);
        fVar220 = auVar229._0_4_ * fVar220;
        fVar242 = auVar229._4_4_ * fVar242;
        auVar51._4_4_ = fVar242;
        auVar51._0_4_ = fVar220;
        fVar189 = auVar229._8_4_ * fVar189;
        auVar51._8_4_ = fVar189;
        fVar244 = auVar229._12_4_ * fVar244;
        auVar51._12_4_ = fVar244;
        fVar265 = auVar229._16_4_ * fVar265;
        auVar51._16_4_ = fVar265;
        fVar268 = auVar229._20_4_ * fVar268;
        auVar51._20_4_ = fVar268;
        fVar191 = auVar229._24_4_ * fVar191;
        auVar51._24_4_ = fVar191;
        auVar51._28_4_ = 0x3f800000;
        fVar250 = local_5e0._0_4_ * (fVar195 * (float)local_a00._0_4_ + (float)local_6c0._0_4_);
        fVar271 = local_5e0._4_4_ * (fVar212 * (float)local_a00._4_4_ + (float)local_6c0._4_4_);
        fVar273 = local_5e0._8_4_ * (fVar213 * fStack_9f8 + fStack_6b8);
        fVar275 = local_5e0._12_4_ * (fVar218 * fStack_9f4 + fStack_6b4);
        fVar322 = local_5e0._16_4_ * (fVar221 * fStack_9f0 + fStack_6b0);
        fVar217 = local_5e0._20_4_ * (fVar241 * fStack_9ec + fStack_6ac);
        fVar219 = local_5e0._24_4_ * (fVar247 * fStack_9e8 + fStack_6a8);
        auVar187._0_4_ = local_aa0 + fVar188 * fVar250;
        auVar187._4_4_ = fStack_a9c + fVar263 * fVar271;
        auVar187._8_4_ = fStack_a98 + fVar194 * fVar273;
        auVar187._12_4_ = fStack_a94 + fVar216 * fVar275;
        auVar187._16_4_ = fStack_a90 + fVar246 * fVar322;
        auVar187._20_4_ = fStack_a8c + fVar269 * fVar217;
        auVar187._24_4_ = fStack_a88 + fVar11 * fVar219;
        auVar187._28_4_ = fStack_a84 + auVar229._28_4_ + fStack_6a4;
        auVar52._4_4_ = fStack_4fc * fVar212;
        auVar52._0_4_ = local_500 * fVar195;
        auVar52._8_4_ = fStack_4f8 * fVar213;
        auVar52._12_4_ = fStack_4f4 * fVar218;
        auVar52._16_4_ = fStack_4f0 * fVar221;
        auVar52._20_4_ = fStack_4ec * fVar241;
        auVar52._24_4_ = fStack_4e8 * fVar247;
        auVar52._28_4_ = fVar248;
        local_a80 = vsubps_avx(auVar52,auVar187);
        auVar209._0_4_ = local_560._0_4_ + fVar174 * fVar250;
        auVar209._4_4_ = local_560._4_4_ + fVar190 * fVar271;
        auVar209._8_4_ = local_560._8_4_ + fVar192 * fVar273;
        auVar209._12_4_ = local_560._12_4_ + fVar214 * fVar275;
        auVar209._16_4_ = local_560._16_4_ + fVar243 * fVar322;
        auVar209._20_4_ = local_560._20_4_ + fVar264 * fVar217;
        auVar209._24_4_ = local_560._24_4_ + fVar308 * fVar219;
        auVar209._28_4_ = local_560._28_4_ + fVar248;
        auVar53._4_4_ = fStack_51c * fVar212;
        auVar53._0_4_ = local_520 * fVar195;
        auVar53._8_4_ = fStack_518 * fVar213;
        auVar53._12_4_ = fStack_514 * fVar218;
        auVar53._16_4_ = fStack_510 * fVar221;
        auVar53._20_4_ = fStack_50c * fVar241;
        auVar53._24_4_ = fStack_508 * fVar247;
        auVar53._28_4_ = fStack_884;
        _local_980 = vsubps_avx(auVar53,auVar209);
        auVar234._0_4_ = local_780._0_4_ + fVar240 * fVar250;
        auVar234._4_4_ = local_780._4_4_ + fVar249 * fVar271;
        auVar234._8_4_ = local_780._8_4_ + fVar193 * fVar273;
        auVar234._12_4_ = local_780._12_4_ + fVar215 * fVar275;
        auVar234._16_4_ = local_780._16_4_ + fVar245 * fVar322;
        auVar234._20_4_ = local_780._20_4_ + fVar266 * fVar217;
        auVar234._24_4_ = local_780._24_4_ + fVar340 * fVar219;
        auVar234._28_4_ = local_780._28_4_ + 0.0;
        auVar54._4_4_ = fStack_53c * fVar212;
        auVar54._0_4_ = local_540 * fVar195;
        auVar54._8_4_ = fStack_538 * fVar213;
        auVar54._12_4_ = fStack_534 * fVar218;
        auVar54._16_4_ = fStack_530 * fVar221;
        auVar54._20_4_ = fStack_52c * fVar241;
        auVar54._24_4_ = fStack_528 * fVar247;
        auVar54._28_4_ = fStack_884;
        _local_8c0 = vsubps_avx(auVar54,auVar234);
        fVar195 = local_5e0._0_4_ * (fVar220 * (float)local_a00._0_4_ + (float)local_6c0._0_4_);
        fVar212 = local_5e0._4_4_ * (fVar242 * (float)local_a00._4_4_ + (float)local_6c0._4_4_);
        fVar213 = local_5e0._8_4_ * (fVar189 * fStack_9f8 + fStack_6b8);
        fVar218 = local_5e0._12_4_ * (fVar244 * fStack_9f4 + fStack_6b4);
        fVar221 = local_5e0._16_4_ * (fVar265 * fStack_9f0 + fStack_6b0);
        fVar241 = local_5e0._20_4_ * (fVar268 * fStack_9ec + fStack_6ac);
        fVar247 = local_5e0._24_4_ * (fVar191 * fStack_9e8 + fStack_6a8);
        auVar259._0_4_ = local_aa0 + fVar188 * fVar195;
        auVar259._4_4_ = fStack_a9c + fVar263 * fVar212;
        auVar259._8_4_ = fStack_a98 + fVar194 * fVar213;
        auVar259._12_4_ = fStack_a94 + fVar216 * fVar218;
        auVar259._16_4_ = fStack_a90 + fVar246 * fVar221;
        auVar259._20_4_ = fStack_a8c + fVar269 * fVar241;
        auVar259._24_4_ = fStack_a88 + fVar11 * fVar247;
        auVar259._28_4_ = fStack_a84 + fStack_884;
        auVar55._4_4_ = fVar242 * fStack_4fc;
        auVar55._0_4_ = fVar220 * local_500;
        auVar55._8_4_ = fVar189 * fStack_4f8;
        auVar55._12_4_ = fVar244 * fStack_4f4;
        auVar55._16_4_ = fVar265 * fStack_4f0;
        auVar55._20_4_ = fVar268 * fStack_4ec;
        auVar55._24_4_ = fVar191 * fStack_4e8;
        auVar55._28_4_ = fStack_4e4;
        _local_400 = vsubps_avx(auVar55,auVar259);
        auVar260._0_4_ = local_560._0_4_ + fVar174 * fVar195;
        auVar260._4_4_ = local_560._4_4_ + fVar190 * fVar212;
        auVar260._8_4_ = local_560._8_4_ + fVar192 * fVar213;
        auVar260._12_4_ = local_560._12_4_ + fVar214 * fVar218;
        auVar260._16_4_ = local_560._16_4_ + fVar243 * fVar221;
        auVar260._20_4_ = local_560._20_4_ + fVar264 * fVar241;
        auVar260._24_4_ = local_560._24_4_ + fVar308 * fVar247;
        auVar260._28_4_ = local_560._28_4_ + local_400._28_4_;
        auVar56._4_4_ = fStack_51c * fVar242;
        auVar56._0_4_ = local_520 * fVar220;
        auVar56._8_4_ = fStack_518 * fVar189;
        auVar56._12_4_ = fStack_514 * fVar244;
        auVar56._16_4_ = fStack_510 * fVar265;
        auVar56._20_4_ = fStack_50c * fVar268;
        auVar56._24_4_ = fStack_508 * fVar191;
        auVar56._28_4_ = fStack_4e4;
        _local_660 = vsubps_avx(auVar56,auVar260);
        auVar235._0_4_ = local_780._0_4_ + fVar240 * fVar195;
        auVar235._4_4_ = local_780._4_4_ + fVar249 * fVar212;
        auVar235._8_4_ = local_780._8_4_ + fVar193 * fVar213;
        auVar235._12_4_ = local_780._12_4_ + fVar215 * fVar218;
        auVar235._16_4_ = local_780._16_4_ + fVar245 * fVar221;
        auVar235._20_4_ = local_780._20_4_ + fVar266 * fVar241;
        auVar235._24_4_ = local_780._24_4_ + fVar340 * fVar247;
        auVar235._28_4_ = local_780._28_4_ + local_8c0._28_4_ + fStack_6a4;
        auVar57._4_4_ = fStack_53c * fVar242;
        auVar57._0_4_ = local_540 * fVar220;
        auVar57._8_4_ = fStack_538 * fVar189;
        auVar57._12_4_ = fStack_534 * fVar244;
        auVar57._16_4_ = fStack_530 * fVar265;
        auVar57._20_4_ = fStack_52c * fVar268;
        auVar57._24_4_ = fStack_528 * fVar191;
        auVar57._28_4_ = local_660._28_4_;
        _local_680 = vsubps_avx(auVar57,auVar235);
        auVar168 = vcmpps_avx(auVar168,_DAT_02020f00,5);
        auVar236._8_4_ = 0x7f800000;
        auVar236._0_8_ = 0x7f8000007f800000;
        auVar236._12_4_ = 0x7f800000;
        auVar236._16_4_ = 0x7f800000;
        auVar236._20_4_ = 0x7f800000;
        auVar236._24_4_ = 0x7f800000;
        auVar236._28_4_ = 0x7f800000;
        auVar128 = vblendvps_avx(auVar236,auVar50,auVar168);
        auVar283._8_4_ = 0x7fffffff;
        auVar283._0_8_ = 0x7fffffff7fffffff;
        auVar283._12_4_ = 0x7fffffff;
        auVar283._16_4_ = 0x7fffffff;
        auVar283._20_4_ = 0x7fffffff;
        auVar283._24_4_ = 0x7fffffff;
        auVar283._28_4_ = 0x7fffffff;
        auVar229 = vandps_avx(auVar283,local_5a0);
        auVar229 = vmaxps_avx(local_3e0,auVar229);
        auVar58._4_4_ = auVar229._4_4_ * 1.9073486e-06;
        auVar58._0_4_ = auVar229._0_4_ * 1.9073486e-06;
        auVar58._8_4_ = auVar229._8_4_ * 1.9073486e-06;
        auVar58._12_4_ = auVar229._12_4_ * 1.9073486e-06;
        auVar58._16_4_ = auVar229._16_4_ * 1.9073486e-06;
        auVar58._20_4_ = auVar229._20_4_ * 1.9073486e-06;
        auVar58._24_4_ = auVar229._24_4_ * 1.9073486e-06;
        auVar58._28_4_ = auVar229._28_4_;
        auVar229 = vandps_avx(auVar283,local_6a0);
        auVar229 = vcmpps_avx(auVar229,auVar58,1);
        auVar237._8_4_ = 0xff800000;
        auVar237._0_8_ = 0xff800000ff800000;
        auVar237._12_4_ = 0xff800000;
        auVar237._16_4_ = 0xff800000;
        auVar237._20_4_ = 0xff800000;
        auVar237._24_4_ = 0xff800000;
        auVar237._28_4_ = 0xff800000;
        auVar233 = vblendvps_avx(auVar237,auVar51,auVar168);
        auVar327 = auVar168 & auVar229;
        if ((((((((auVar327 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar327 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar327 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar327 >> 0x7f,0) != '\0') ||
              (auVar327 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar327 >> 0xbf,0) != '\0') ||
            (auVar327 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar327[0x1f] < '\0') {
          auVar184 = vandps_avx(auVar229,auVar168);
          auVar115 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar327 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar229 = vcmpps_avx(auVar93,auVar327,2);
          auVar344._8_4_ = 0xff800000;
          auVar344._0_8_ = 0xff800000ff800000;
          auVar344._12_4_ = 0xff800000;
          auVar344._16_4_ = 0xff800000;
          auVar344._20_4_ = 0xff800000;
          auVar344._24_4_ = 0xff800000;
          auVar344._28_4_ = 0xff800000;
          auVar352._8_4_ = 0x7f800000;
          auVar352._0_8_ = 0x7f8000007f800000;
          auVar352._12_4_ = 0x7f800000;
          auVar352._16_4_ = 0x7f800000;
          auVar352._20_4_ = 0x7f800000;
          auVar352._24_4_ = 0x7f800000;
          auVar352._28_4_ = 0x7f800000;
          auVar93 = vblendvps_avx(auVar352,auVar344,auVar229);
          auVar83 = vpmovsxwd_avx(auVar115);
          auVar115 = vpunpckhwd_avx(auVar115,auVar115);
          auVar284._16_16_ = auVar115;
          auVar284._0_16_ = auVar83;
          auVar128 = vblendvps_avx(auVar128,auVar93,auVar284);
          auVar93 = vblendvps_avx(auVar344,auVar352,auVar229);
          auVar233 = vblendvps_avx(auVar233,auVar93,auVar284);
          auVar93 = vcmpps_avx(auVar327,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar173._0_4_ = auVar184._0_4_ ^ auVar93._0_4_;
          auVar173._4_4_ = auVar184._4_4_ ^ auVar93._4_4_;
          auVar173._8_4_ = auVar184._8_4_ ^ auVar93._8_4_;
          auVar173._12_4_ = auVar184._12_4_ ^ auVar93._12_4_;
          auVar173._16_4_ = auVar184._16_4_ ^ auVar93._16_4_;
          auVar173._20_4_ = auVar184._20_4_ ^ auVar93._20_4_;
          auVar173._24_4_ = auVar184._24_4_ ^ auVar93._24_4_;
          auVar173._28_4_ = auVar184._28_4_ ^ auVar93._28_4_;
          auVar184 = vorps_avx(auVar229,auVar173);
          auVar184 = vandps_avx(auVar168,auVar184);
        }
        auVar183 = local_a80._0_28_;
        auVar207 = local_980._0_28_;
        auVar298 = local_8c0._0_28_;
      }
      auVar262 = ZEXT3264(_local_8a0);
      fVar220 = (ray->super_RayK<1>).dir.field_0.m128[0];
      local_780._4_4_ = fVar220;
      local_780._0_4_ = fVar220;
      local_780._8_4_ = fVar220;
      local_780._12_4_ = fVar220;
      local_780._16_4_ = fVar220;
      local_780._20_4_ = fVar220;
      local_780._24_4_ = fVar220;
      local_780._28_4_ = fVar220;
      auVar307 = ZEXT3264(local_780);
      fVar174 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar240 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_440 = _local_7a0;
      local_420 = vminps_avx(local_460,auVar128);
      _local_480 = vmaxps_avx(_local_7a0,auVar233);
      auVar93 = vcmpps_avx(_local_7a0,local_420,2);
      local_5a0 = vandps_avx(auVar98,auVar93);
      local_600 = local_5a0;
      auVar93 = vcmpps_avx(_local_480,local_460,2);
      local_620 = vandps_avx(auVar98,auVar93);
      auVar98 = vorps_avx(local_620,local_5a0);
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f])
      {
LAB_00f18842:
        auVar229._8_4_ = 0x3f800000;
        auVar229._0_8_ = &DAT_3f8000003f800000;
        auVar229._12_4_ = 0x3f800000;
        auVar229._16_4_ = 0x3f800000;
        auVar229._20_4_ = 0x3f800000;
        auVar229._24_4_ = 0x3f800000;
        auVar229._28_4_ = 0x3f800000;
      }
      else {
        auVar98 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_6c0._0_4_ = auVar184._0_4_ ^ auVar98._0_4_;
        local_6c0._4_4_ = auVar184._4_4_ ^ auVar98._4_4_;
        fStack_6b8 = (float)(auVar184._8_4_ ^ auVar98._8_4_);
        fStack_6b4 = (float)(auVar184._12_4_ ^ auVar98._12_4_);
        fStack_6b0 = (float)(auVar184._16_4_ ^ auVar98._16_4_);
        fStack_6ac = (float)(auVar184._20_4_ ^ auVar98._20_4_);
        fStack_6a8 = (float)(auVar184._24_4_ ^ auVar98._24_4_);
        fStack_6a4 = (float)((uint)auVar184._28_4_ ^ (uint)auVar98._28_4_);
        auVar97._0_4_ =
             fVar220 * auVar183._0_4_ + fVar174 * auVar207._0_4_ + auVar298._0_4_ * fVar240;
        auVar97._4_4_ =
             fVar220 * auVar183._4_4_ + fVar174 * auVar207._4_4_ + auVar298._4_4_ * fVar240;
        auVar97._8_4_ =
             fVar220 * auVar183._8_4_ + fVar174 * auVar207._8_4_ + auVar298._8_4_ * fVar240;
        auVar97._12_4_ =
             fVar220 * auVar183._12_4_ + fVar174 * auVar207._12_4_ + auVar298._12_4_ * fVar240;
        auVar97._16_4_ =
             fVar220 * auVar183._16_4_ + fVar174 * auVar207._16_4_ + auVar298._16_4_ * fVar240;
        auVar97._20_4_ =
             fVar220 * auVar183._20_4_ + fVar174 * auVar207._20_4_ + auVar298._20_4_ * fVar240;
        auVar97._24_4_ =
             fVar220 * auVar183._24_4_ + fVar174 * auVar207._24_4_ + auVar298._24_4_ * fVar240;
        auVar97._28_4_ = auVar98._28_4_ + local_5a0._28_4_ + auVar184._28_4_;
        auVar131._8_4_ = 0x7fffffff;
        auVar131._0_8_ = 0x7fffffff7fffffff;
        auVar131._12_4_ = 0x7fffffff;
        auVar131._16_4_ = 0x7fffffff;
        auVar131._20_4_ = 0x7fffffff;
        auVar131._24_4_ = 0x7fffffff;
        auVar131._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar97,auVar131);
        auVar132._8_4_ = 0x3e99999a;
        auVar132._0_8_ = 0x3e99999a3e99999a;
        auVar132._12_4_ = 0x3e99999a;
        auVar132._16_4_ = 0x3e99999a;
        auVar132._20_4_ = 0x3e99999a;
        auVar132._24_4_ = 0x3e99999a;
        auVar132._28_4_ = 0x3e99999a;
        auVar98 = vcmpps_avx(auVar98,auVar132,1);
        auVar98 = vorps_avx(auVar98,_local_6c0);
        auVar133._8_4_ = 3;
        auVar133._0_8_ = 0x300000003;
        auVar133._12_4_ = 3;
        auVar133._16_4_ = 3;
        auVar133._20_4_ = 3;
        auVar133._24_4_ = 3;
        auVar133._28_4_ = 3;
        auVar169._8_4_ = 2;
        auVar169._0_8_ = 0x200000002;
        auVar169._12_4_ = 2;
        auVar169._16_4_ = 2;
        auVar169._20_4_ = 2;
        auVar169._24_4_ = 2;
        auVar169._28_4_ = 2;
        auVar98 = vblendvps_avx(auVar169,auVar133,auVar98);
        local_6a0 = ZEXT432((uint)uVar74);
        auVar83 = vpshufd_avx(ZEXT416((uint)uVar74),0);
        auVar115 = vpcmpgtd_avx(auVar98._16_16_,auVar83);
        local_5e0._0_16_ = auVar83;
        auVar83 = vpcmpgtd_avx(auVar98._0_16_,auVar83);
        auVar134._16_16_ = auVar115;
        auVar134._0_16_ = auVar83;
        auVar98 = vblendps_avx(ZEXT1632(auVar83),auVar134,0xf0);
        local_600 = vandnps_avx(auVar98,local_5a0);
        auVar211 = ZEXT3264(local_600);
        local_5c0 = auVar98;
        auVar184 = local_5a0 & ~auVar98;
        auVar262 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_640._0_8_ = uVar74;
        auVar229 = local_620;
        auVar93 = _local_480;
        fVar220 = fVar174;
        fVar188 = fVar174;
        fVar242 = fVar174;
        fVar189 = fVar174;
        fVar244 = fVar174;
        fVar190 = fVar174;
        fVar249 = fVar240;
        fVar263 = fVar240;
        fVar265 = fVar240;
        fVar268 = fVar240;
        fVar191 = fVar240;
        fVar192 = fVar240;
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0x7f,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar184 >> 0xbf,0) != '\0') ||
            (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar184[0x1f] < '\0') {
          local_580._4_4_ = (float)local_7a0._4_4_ + (float)local_8a0._4_4_;
          local_580._0_4_ = (float)local_7a0._0_4_ + (float)local_8a0._0_4_;
          fStack_578 = fStack_798 + fStack_898;
          fStack_574 = fStack_794 + fStack_894;
          fStack_570 = fStack_790 + fStack_890;
          fStack_56c = fStack_78c + fStack_88c;
          fStack_568 = fStack_788 + fStack_888;
          fStack_564 = fStack_784 + fStack_884;
          local_8e0._4_4_ = fVar174;
          local_8e0._0_4_ = fVar174;
          fStack_8d8 = fVar174;
          fStack_8d4 = fVar174;
          fStack_8d0 = fVar174;
          fStack_8cc = fVar174;
          fStack_8c8 = fVar174;
          fStack_8c4 = fVar174;
          local_820 = local_620;
          local_840._4_4_ = fVar240;
          local_840._0_4_ = fVar240;
          fStack_838 = fVar240;
          fStack_834 = fVar240;
          fStack_830 = fVar240;
          fStack_82c = fVar240;
          fStack_828 = fVar240;
          fStack_824 = fVar240;
          local_560 = _local_480;
          _local_7a0 = auVar14;
          do {
            auVar199 = auVar262._0_16_;
            auVar135._8_4_ = 0x7f800000;
            auVar135._0_8_ = 0x7f8000007f800000;
            auVar135._12_4_ = 0x7f800000;
            auVar135._16_4_ = 0x7f800000;
            auVar135._20_4_ = 0x7f800000;
            auVar135._24_4_ = 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar98 = auVar211._0_32_;
            auVar184 = vblendvps_avx(auVar135,_local_7a0,auVar98);
            auVar93 = vshufps_avx(auVar184,auVar184,0xb1);
            auVar93 = vminps_avx(auVar184,auVar93);
            auVar229 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar229);
            auVar229 = vperm2f128_avx(auVar93,auVar93,1);
            auVar93 = vminps_avx(auVar93,auVar229);
            auVar184 = vcmpps_avx(auVar184,auVar93,0);
            auVar93 = auVar98 & auVar184;
            if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar93 >> 0x7f,0) != '\0') ||
                  (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar93 >> 0xbf,0) != '\0') ||
                (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar93[0x1f] < '\0') {
              auVar98 = vandps_avx(auVar184,auVar98);
            }
            uVar73 = vmovmskps_avx(auVar98);
            uVar69 = 0;
            if (uVar73 != 0) {
              for (; (uVar73 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
              }
            }
            uVar74 = (ulong)uVar69;
            *(undefined4 *)(local_600 + uVar74 * 4) = 0;
            aVar6 = (ray->super_RayK<1>).dir.field_0;
            _local_8c0 = (undefined1  [16])aVar6;
            auVar115 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
            local_aa0 = local_4c0[uVar74];
            auVar307 = ZEXT464((uint)local_aa0);
            auVar211 = ZEXT464(*(uint *)(local_440 + uVar74 * 4));
            if (auVar115._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              local_ae0._0_16_ = ZEXT416(*(uint *)(local_440 + uVar74 * 4));
              fVar220 = sqrtf(auVar115._0_4_);
              auVar211 = ZEXT1664(local_ae0._0_16_);
              auVar307 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar199._8_4_ = 0x7fffffff;
              auVar199._0_8_ = 0x7fffffff7fffffff;
              auVar199._12_4_ = 0x7fffffff;
            }
            else {
              auVar115 = vsqrtss_avx(auVar115,auVar115);
              fVar220 = auVar115._0_4_;
            }
            auVar83 = vminps_avx(_local_990,_local_9b0);
            auVar115 = vmaxps_avx(_local_990,_local_9b0);
            auVar88 = vminps_avx(_local_9a0,_local_9c0);
            auVar114 = vminps_avx(auVar83,auVar88);
            auVar83 = vmaxps_avx(_local_9a0,_local_9c0);
            auVar88 = vmaxps_avx(auVar115,auVar83);
            auVar115 = vandps_avx(auVar114,auVar199);
            auVar83 = vandps_avx(auVar88,auVar199);
            auVar115 = vmaxps_avx(auVar115,auVar83);
            auVar83 = vmovshdup_avx(auVar115);
            auVar83 = vmaxss_avx(auVar83,auVar115);
            auVar115 = vshufpd_avx(auVar115,auVar115,1);
            auVar115 = vmaxss_avx(auVar115,auVar83);
            local_860._0_4_ = auVar115._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar220 * 1.9073486e-06;
            _local_760 = vshufps_avx(auVar88,auVar88,0xff);
            lVar72 = 4;
            do {
              local_aa0 = auVar307._0_4_;
              local_9e0._0_4_ = 1.0 - local_aa0;
              auVar115 = vshufps_avx(auVar307._0_16_,auVar307._0_16_,0);
              fVar220 = auVar115._0_4_;
              fVar174 = auVar115._4_4_;
              fVar240 = auVar115._8_4_;
              fVar188 = auVar115._12_4_;
              auVar115 = vshufps_avx(ZEXT416((uint)local_9e0._0_4_),ZEXT416((uint)local_9e0._0_4_),0
                                    );
              fVar242 = auVar115._0_4_;
              fVar189 = auVar115._4_4_;
              fVar244 = auVar115._8_4_;
              fVar190 = auVar115._12_4_;
              fVar249 = (float)local_9a0._0_4_ * fVar220 + (float)local_9b0._0_4_ * fVar242;
              fVar263 = (float)local_9a0._4_4_ * fVar174 + (float)local_9b0._4_4_ * fVar189;
              fVar265 = fStack_998 * fVar240 + fStack_9a8 * fVar244;
              fVar268 = fStack_994 * fVar188 + fStack_9a4 * fVar190;
              auVar224._0_4_ =
                   fVar242 * ((float)local_9b0._0_4_ * fVar220 + fVar242 * (float)local_990._0_4_) +
                   fVar220 * fVar249;
              auVar224._4_4_ =
                   fVar189 * ((float)local_9b0._4_4_ * fVar174 + fVar189 * (float)local_990._4_4_) +
                   fVar174 * fVar263;
              auVar224._8_4_ =
                   fVar244 * (fStack_9a8 * fVar240 + fVar244 * fStack_988) + fVar240 * fVar265;
              auVar224._12_4_ =
                   fVar190 * (fStack_9a4 * fVar188 + fVar190 * fStack_984) + fVar188 * fVar268;
              auVar177._0_4_ =
                   fVar242 * fVar249 +
                   fVar220 * (fVar220 * (float)local_9c0._0_4_ + (float)local_9a0._0_4_ * fVar242);
              auVar177._4_4_ =
                   fVar189 * fVar263 +
                   fVar174 * (fVar174 * (float)local_9c0._4_4_ + (float)local_9a0._4_4_ * fVar189);
              auVar177._8_4_ =
                   fVar244 * fVar265 + fVar240 * (fVar240 * fStack_9b8 + fStack_998 * fVar244);
              auVar177._12_4_ =
                   fVar190 * fVar268 + fVar188 * (fVar188 * fStack_9b4 + fStack_994 * fVar190);
              auVar83 = auVar211._0_16_;
              auVar115 = vshufps_avx(auVar83,auVar83,0);
              auVar111._0_4_ = auVar115._0_4_ * (float)local_8c0._0_4_ + 0.0;
              auVar111._4_4_ = auVar115._4_4_ * (float)local_8c0._4_4_ + 0.0;
              auVar111._8_4_ = auVar115._8_4_ * fStack_8b8 + 0.0;
              auVar111._12_4_ = auVar115._12_4_ * fStack_8b4 + 0.0;
              auVar82._0_4_ = fVar242 * auVar224._0_4_ + fVar220 * auVar177._0_4_;
              auVar82._4_4_ = fVar189 * auVar224._4_4_ + fVar174 * auVar177._4_4_;
              auVar82._8_4_ = fVar244 * auVar224._8_4_ + fVar240 * auVar177._8_4_;
              auVar82._12_4_ = fVar190 * auVar224._12_4_ + fVar188 * auVar177._12_4_;
              local_6e0._0_16_ = auVar82;
              auVar115 = vsubps_avx(auVar111,auVar82);
              _local_980 = auVar115;
              auVar115 = vdpps_avx(auVar115,auVar115,0x7f);
              fStack_a9c = auVar307._4_4_;
              fStack_a98 = auVar307._8_4_;
              fStack_a94 = auVar307._12_4_;
              local_ae0._0_16_ = auVar83;
              local_a80._0_16_ = auVar115;
              if (auVar115._0_4_ < 0.0) {
                local_9e0._0_16_ = ZEXT416((uint)local_9e0._0_4_);
                local_940._0_16_ = auVar224;
                local_880._0_16_ = auVar177;
                fVar220 = sqrtf(auVar115._0_4_);
                auVar211 = ZEXT1664(local_ae0._0_16_);
                auVar307 = ZEXT1664(CONCAT412(fStack_a94,
                                              CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
                auVar177 = local_880._0_16_;
                auVar224 = local_940._0_16_;
              }
              else {
                auVar115 = vsqrtss_avx(auVar115,auVar115);
                fVar220 = auVar115._0_4_;
              }
              auVar115 = vsubps_avx(auVar177,auVar224);
              auVar253._0_4_ = auVar115._0_4_ * 3.0;
              auVar253._4_4_ = auVar115._4_4_ * 3.0;
              auVar253._8_4_ = auVar115._8_4_ * 3.0;
              auVar253._12_4_ = auVar115._12_4_ * 3.0;
              fVar174 = auVar307._0_4_;
              auVar115 = vshufps_avx(ZEXT416((uint)(fVar174 * 6.0)),ZEXT416((uint)(fVar174 * 6.0)),0
                                    );
              auVar83 = ZEXT416((uint)(((float)local_9e0._0_4_ - (fVar174 + fVar174)) * 6.0));
              auVar88 = vshufps_avx(auVar83,auVar83,0);
              auVar83 = ZEXT416((uint)((fVar174 - ((float)local_9e0._0_4_ + (float)local_9e0._0_4_))
                                      * 6.0));
              auVar114 = vshufps_avx(auVar83,auVar83,0);
              auVar12 = vshufps_avx(ZEXT416((uint)((float)local_9e0._0_4_ * 6.0)),
                                    ZEXT416((uint)((float)local_9e0._0_4_ * 6.0)),0);
              auVar83 = vdpps_avx(auVar253,auVar253,0x7f);
              auVar112._0_4_ =
                   auVar12._0_4_ * (float)local_990._0_4_ +
                   auVar114._0_4_ * (float)local_9b0._0_4_ +
                   auVar115._0_4_ * (float)local_9c0._0_4_ + auVar88._0_4_ * (float)local_9a0._0_4_;
              auVar112._4_4_ =
                   auVar12._4_4_ * (float)local_990._4_4_ +
                   auVar114._4_4_ * (float)local_9b0._4_4_ +
                   auVar115._4_4_ * (float)local_9c0._4_4_ + auVar88._4_4_ * (float)local_9a0._4_4_;
              auVar112._8_4_ =
                   auVar12._8_4_ * fStack_988 +
                   auVar114._8_4_ * fStack_9a8 +
                   auVar115._8_4_ * fStack_9b8 + auVar88._8_4_ * fStack_998;
              auVar112._12_4_ =
                   auVar12._12_4_ * fStack_984 +
                   auVar114._12_4_ * fStack_9a4 +
                   auVar115._12_4_ * fStack_9b4 + auVar88._12_4_ * fStack_994;
              auVar115 = vblendps_avx(auVar83,_DAT_01feba10,0xe);
              auVar88 = vrsqrtss_avx(auVar115,auVar115);
              fVar240 = auVar88._0_4_;
              fVar174 = auVar83._0_4_;
              auVar88 = vdpps_avx(auVar253,auVar112,0x7f);
              auVar114 = vshufps_avx(auVar83,auVar83,0);
              auVar113._0_4_ = auVar112._0_4_ * auVar114._0_4_;
              auVar113._4_4_ = auVar112._4_4_ * auVar114._4_4_;
              auVar113._8_4_ = auVar112._8_4_ * auVar114._8_4_;
              auVar113._12_4_ = auVar112._12_4_ * auVar114._12_4_;
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar200._0_4_ = auVar253._0_4_ * auVar88._0_4_;
              auVar200._4_4_ = auVar253._4_4_ * auVar88._4_4_;
              auVar200._8_4_ = auVar253._8_4_ * auVar88._8_4_;
              auVar200._12_4_ = auVar253._12_4_ * auVar88._12_4_;
              auVar12 = vsubps_avx(auVar113,auVar200);
              auVar88 = vrcpss_avx(auVar115,auVar115);
              auVar115 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                    ZEXT416((uint)(auVar211._0_4_ * (float)local_7e0._0_4_)));
              auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar174 * auVar88._0_4_)));
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              uVar74 = CONCAT44(auVar253._4_4_,auVar253._0_4_);
              auVar297._0_8_ = uVar74 ^ 0x8000000080000000;
              auVar297._8_4_ = -auVar253._8_4_;
              auVar297._12_4_ = -auVar253._12_4_;
              auVar114 = ZEXT416((uint)(fVar240 * 1.5 + fVar174 * -0.5 * fVar240 * fVar240 * fVar240
                                       ));
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar178._0_4_ = auVar114._0_4_ * auVar12._0_4_ * auVar88._0_4_;
              auVar178._4_4_ = auVar114._4_4_ * auVar12._4_4_ * auVar88._4_4_;
              auVar178._8_4_ = auVar114._8_4_ * auVar12._8_4_ * auVar88._8_4_;
              auVar178._12_4_ = auVar114._12_4_ * auVar12._12_4_ * auVar88._12_4_;
              local_a00._0_4_ = auVar253._0_4_ * auVar114._0_4_;
              local_a00._4_4_ = auVar253._4_4_ * auVar114._4_4_;
              fStack_9f8 = auVar253._8_4_ * auVar114._8_4_;
              fStack_9f4 = auVar253._12_4_ * auVar114._12_4_;
              local_9e0._0_16_ = auVar253;
              local_940._0_4_ = auVar115._0_4_;
              if (fVar174 < 0.0) {
                local_880._0_4_ = fVar220;
                local_960._0_16_ = auVar297;
                local_800._0_16_ = auVar178;
                fVar174 = sqrtf(fVar174);
                auVar178 = local_800._0_16_;
                auVar297 = local_960._0_16_;
                fVar193 = (float)local_940._0_4_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar174 = auVar83._0_4_;
                local_880._0_4_ = fVar220;
                fVar193 = auVar115._0_4_;
              }
              auVar115 = vdpps_avx(_local_980,_local_a00,0x7f);
              local_960._0_4_ =
                   ((float)local_860._0_4_ / fVar174) * ((float)local_880._0_4_ + 1.0) +
                   fVar193 + (float)local_880._0_4_ * (float)local_860._0_4_;
              auVar83 = vdpps_avx(auVar297,_local_a00,0x7f);
              auVar88 = vdpps_avx(_local_980,auVar178,0x7f);
              auVar114 = vdpps_avx(_local_8c0,_local_a00,0x7f);
              auVar12 = vdpps_avx(_local_980,auVar297,0x7f);
              fVar220 = auVar83._0_4_ + auVar88._0_4_;
              fVar174 = auVar115._0_4_;
              auVar84._0_4_ = fVar174 * fVar174;
              auVar84._4_4_ = auVar115._4_4_ * auVar115._4_4_;
              auVar84._8_4_ = auVar115._8_4_ * auVar115._8_4_;
              auVar84._12_4_ = auVar115._12_4_ * auVar115._12_4_;
              auVar88 = vsubps_avx(local_a80._0_16_,auVar84);
              _local_a00 = ZEXT416((uint)fVar220);
              auVar83 = vdpps_avx(_local_980,_local_8c0,0x7f);
              fVar240 = auVar12._0_4_ - fVar174 * fVar220;
              local_880._0_16_ = auVar115;
              fVar174 = auVar83._0_4_ - fVar174 * auVar114._0_4_;
              auVar115 = vrsqrtss_avx(auVar88,auVar88);
              fVar188 = auVar88._0_4_;
              fVar220 = auVar115._0_4_;
              fVar220 = fVar220 * 1.5 + fVar188 * -0.5 * fVar220 * fVar220 * fVar220;
              if (fVar188 < 0.0) {
                local_800._0_16_ = auVar114;
                local_700._0_4_ = fVar240;
                local_720._0_4_ = fVar174;
                local_740._0_4_ = fVar220;
                fVar188 = sqrtf(fVar188);
                fVar220 = (float)local_740._0_4_;
                fVar240 = (float)local_700._0_4_;
                fVar174 = (float)local_720._0_4_;
                auVar114 = local_800._0_16_;
                fVar193 = (float)local_940._0_4_;
              }
              else {
                auVar115 = vsqrtss_avx(auVar88,auVar88);
                fVar188 = auVar115._0_4_;
              }
              auVar83 = vpermilps_avx(local_6e0._0_16_,0xff);
              auVar12 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
              fVar240 = fVar240 * fVar220 - auVar12._0_4_;
              auVar201._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar201._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar201._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar225._0_4_ = -fVar240;
              auVar225._4_4_ = 0x80000000;
              auVar225._8_4_ = 0x80000000;
              auVar225._12_4_ = 0x80000000;
              auVar115 = vinsertps_avx(ZEXT416((uint)(fVar174 * fVar220)),auVar201,0x10);
              auVar88 = vmovsldup_avx(ZEXT416((uint)(local_a00._0_4_ * fVar174 * fVar220 -
                                                    auVar114._0_4_ * fVar240)));
              auVar115 = vdivps_avx(auVar115,auVar88);
              auVar114 = ZEXT416((uint)(fVar188 - auVar83._0_4_));
              auVar83 = vinsertps_avx(local_880._0_16_,auVar114,0x10);
              auVar179._0_4_ = auVar83._0_4_ * auVar115._0_4_;
              auVar179._4_4_ = auVar83._4_4_ * auVar115._4_4_;
              auVar179._8_4_ = auVar83._8_4_ * auVar115._8_4_;
              auVar179._12_4_ = auVar83._12_4_ * auVar115._12_4_;
              auVar115 = vinsertps_avx(auVar225,_local_a00,0x1c);
              auVar115 = vdivps_avx(auVar115,auVar88);
              auVar161._0_4_ = auVar83._0_4_ * auVar115._0_4_;
              auVar161._4_4_ = auVar83._4_4_ * auVar115._4_4_;
              auVar161._8_4_ = auVar83._8_4_ * auVar115._8_4_;
              auVar161._12_4_ = auVar83._12_4_ * auVar115._12_4_;
              auVar115 = vhaddps_avx(auVar179,auVar179);
              auVar83 = vhaddps_avx(auVar161,auVar161);
              local_aa0 = local_aa0 - auVar115._0_4_;
              auVar307 = ZEXT464((uint)local_aa0);
              fVar194 = (float)local_ae0._0_4_ - auVar83._0_4_;
              auVar211 = ZEXT464((uint)fVar194);
              auVar202._8_4_ = 0x7fffffff;
              auVar202._0_8_ = 0x7fffffff7fffffff;
              auVar202._12_4_ = 0x7fffffff;
              auVar262 = ZEXT1664(auVar202);
              auVar115 = vandps_avx(local_880._0_16_,auVar202);
              fVar220 = (float)local_8e0._4_4_;
              fVar188 = fStack_8d8;
              fVar242 = fStack_8d4;
              fVar189 = fStack_8d0;
              fVar244 = fStack_8cc;
              fVar190 = fStack_8c8;
              fVar174 = (float)local_8e0._0_4_;
              fVar249 = (float)local_840._4_4_;
              fVar263 = fStack_838;
              fVar265 = fStack_834;
              fVar268 = fStack_830;
              fVar191 = fStack_82c;
              fVar192 = fStack_828;
              fVar240 = (float)local_840._0_4_;
              if ((float)local_960._0_4_ <= auVar115._0_4_) {
LAB_00f190fd:
                bVar45 = false;
              }
              else {
                auVar115 = vandps_avx(auVar114,auVar202);
                if ((float)local_760._0_4_ * 1.9073486e-06 + fVar193 + (float)local_960._0_4_ <=
                    auVar115._0_4_) goto LAB_00f190fd;
                fVar194 = fVar194 + (float)local_7c0._0_4_;
                auVar211 = ZEXT464((uint)fVar194);
                bVar45 = true;
                if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar194) &&
                     (fVar193 = (ray->super_RayK<1>).tfar, fVar194 <= fVar193)) &&
                    (0.0 <= local_aa0)) && (local_aa0 <= 1.0)) {
                  auVar115 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                  fVar195 = auVar115._0_4_;
                  pGVar8 = (context->scene->geometries).items[local_aa8].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar115 = ZEXT416((uint)(fVar195 * 1.5 +
                                             local_a80._0_4_ * -0.5 * fVar195 * fVar195 * fVar195));
                    auVar115 = vshufps_avx(auVar115,auVar115,0);
                    auVar116._0_4_ = auVar115._0_4_ * (float)local_980._0_4_;
                    auVar116._4_4_ = auVar115._4_4_ * (float)local_980._4_4_;
                    auVar116._8_4_ = auVar115._8_4_ * fStack_978;
                    auVar116._12_4_ = auVar115._12_4_ * fStack_974;
                    auVar85._0_4_ = local_9e0._0_4_ + auVar12._0_4_ * auVar116._0_4_;
                    auVar85._4_4_ = local_9e0._4_4_ + auVar12._4_4_ * auVar116._4_4_;
                    auVar85._8_4_ = local_9e0._8_4_ + auVar12._8_4_ * auVar116._8_4_;
                    auVar85._12_4_ = local_9e0._12_4_ + auVar12._12_4_ * auVar116._12_4_;
                    auVar115 = vshufps_avx(auVar116,auVar116,0xc9);
                    auVar83 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                    auVar117._0_4_ = auVar83._0_4_ * auVar116._0_4_;
                    auVar117._4_4_ = auVar83._4_4_ * auVar116._4_4_;
                    auVar117._8_4_ = auVar83._8_4_ * auVar116._8_4_;
                    auVar117._12_4_ = auVar83._12_4_ * auVar116._12_4_;
                    auVar162._0_4_ = local_9e0._0_4_ * auVar115._0_4_;
                    auVar162._4_4_ = local_9e0._4_4_ * auVar115._4_4_;
                    auVar162._8_4_ = local_9e0._8_4_ * auVar115._8_4_;
                    auVar162._12_4_ = local_9e0._12_4_ * auVar115._12_4_;
                    auVar88 = vsubps_avx(auVar162,auVar117);
                    auVar115 = vshufps_avx(auVar88,auVar88,0xc9);
                    auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar163._0_4_ = auVar83._0_4_ * auVar115._0_4_;
                    auVar163._4_4_ = auVar83._4_4_ * auVar115._4_4_;
                    auVar163._8_4_ = auVar83._8_4_ * auVar115._8_4_;
                    auVar163._12_4_ = auVar83._12_4_ * auVar115._12_4_;
                    auVar115 = vshufps_avx(auVar88,auVar88,0xd2);
                    auVar86._0_4_ = auVar85._0_4_ * auVar115._0_4_;
                    auVar86._4_4_ = auVar85._4_4_ * auVar115._4_4_;
                    auVar86._8_4_ = auVar85._8_4_ * auVar115._8_4_;
                    auVar86._12_4_ = auVar85._12_4_ * auVar115._12_4_;
                    auVar115 = vsubps_avx(auVar163,auVar86);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar194;
                      auVar83 = vshufps_avx(auVar115,auVar115,0xe9);
                      uVar3 = vmovlps_avx(auVar83);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar3;
                      (ray->Ng).field_0.field_0.z = auVar115._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = (uint)local_a48;
                      ray->geomID = (uint)local_aa8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar83 = vshufps_avx(auVar115,auVar115,0xe9);
                      local_910 = vmovlps_avx(auVar83);
                      local_908 = auVar115._0_4_;
                      local_904 = local_aa0;
                      local_900 = 0;
                      local_8fc = (uint)local_a48;
                      local_8f8 = (uint)local_aa8;
                      local_8f4 = context->user->instID[0];
                      local_8f0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar194;
                      local_ae4 = -1;
                      local_a30.valid = &local_ae4;
                      local_a30.geometryUserPtr = pGVar8->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_910;
                      local_a30.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      local_ae0._0_16_ = ZEXT416((uint)fVar194);
                      local_a80._0_4_ = fVar193;
                      if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f19258:
                        p_Var10 = context->args->filter;
                        fVar174 = (float)local_8e0._0_4_;
                        fVar220 = (float)local_8e0._4_4_;
                        fVar188 = fStack_8d8;
                        fVar242 = fStack_8d4;
                        fVar189 = fStack_8d0;
                        fVar244 = fStack_8cc;
                        fVar190 = fStack_8c8;
                        fVar240 = (float)local_840._0_4_;
                        fVar249 = (float)local_840._4_4_;
                        fVar263 = fStack_838;
                        fVar265 = fStack_834;
                        fVar268 = fStack_830;
                        fVar191 = fStack_82c;
                        fVar192 = fStack_828;
                        if (p_Var10 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var10)(&local_a30);
                            auVar211 = ZEXT1664(local_ae0._0_16_);
                            auVar307 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar262 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            fVar193 = (float)local_a80._0_4_;
                            fVar174 = (float)local_8e0._0_4_;
                            fVar220 = (float)local_8e0._4_4_;
                            fVar188 = fStack_8d8;
                            fVar242 = fStack_8d4;
                            fVar189 = fStack_8d0;
                            fVar244 = fStack_8cc;
                            fVar190 = fStack_8c8;
                            fVar240 = (float)local_840._0_4_;
                            fVar249 = (float)local_840._4_4_;
                            fVar263 = fStack_838;
                            fVar265 = fStack_834;
                            fVar268 = fStack_830;
                            fVar191 = fStack_82c;
                            fVar192 = fStack_828;
                          }
                          if (*local_a30.valid == 0) goto LAB_00f19328;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        (*pGVar8->intersectionFilterN)(&local_a30);
                        auVar211 = ZEXT1664(local_ae0._0_16_);
                        auVar307 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar262 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        fVar193 = (float)local_a80._0_4_;
                        fVar174 = (float)local_8e0._0_4_;
                        fVar220 = (float)local_8e0._4_4_;
                        fVar188 = fStack_8d8;
                        fVar242 = fStack_8d4;
                        fVar189 = fStack_8d0;
                        fVar244 = fStack_8cc;
                        fVar190 = fStack_8c8;
                        fVar240 = (float)local_840._0_4_;
                        fVar249 = (float)local_840._4_4_;
                        fVar263 = fStack_838;
                        fVar265 = fStack_834;
                        fVar268 = fStack_830;
                        fVar191 = fStack_82c;
                        fVar192 = fStack_828;
                        if (*local_a30.valid != 0) goto LAB_00f19258;
LAB_00f19328:
                        (ray->super_RayK<1>).tfar = fVar193;
                      }
                    }
                  }
                }
              }
              auVar184 = local_600;
              bVar75 = lVar72 != 0;
              lVar72 = lVar72 + -1;
            } while ((!bVar45) && (bVar75));
            fVar193 = (ray->super_RayK<1>).tfar;
            auVar99._4_4_ = fVar193;
            auVar99._0_4_ = fVar193;
            auVar99._8_4_ = fVar193;
            auVar99._12_4_ = fVar193;
            auVar99._16_4_ = fVar193;
            auVar99._20_4_ = fVar193;
            auVar99._24_4_ = fVar193;
            auVar99._28_4_ = fVar193;
            auVar98 = vcmpps_avx(_local_580,auVar99,2);
            local_600 = vandps_avx(auVar98,local_600);
            auVar211 = ZEXT3264(local_600);
            auVar184 = auVar184 & auVar98;
            auVar307 = ZEXT3264(local_780);
            uVar74 = local_640._0_8_;
            auVar229 = local_820;
            auVar93 = local_560;
          } while ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar184 >> 0x7f,0) != '\0') ||
                     (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar184 >> 0xbf,0) != '\0') ||
                   (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar184[0x1f] < '\0');
        }
        auVar100._0_4_ =
             auVar307._0_4_ * (float)local_400._0_4_ +
             fVar174 * (float)local_660._0_4_ + fVar240 * (float)local_680._0_4_;
        auVar100._4_4_ =
             auVar307._4_4_ * (float)local_400._4_4_ +
             fVar220 * (float)local_660._4_4_ + fVar249 * (float)local_680._4_4_;
        auVar100._8_4_ = auVar307._8_4_ * fStack_3f8 + fVar188 * fStack_658 + fVar263 * fStack_678;
        auVar100._12_4_ = auVar307._12_4_ * fStack_3f4 + fVar242 * fStack_654 + fVar265 * fStack_674
        ;
        auVar100._16_4_ = auVar307._16_4_ * fStack_3f0 + fVar189 * fStack_650 + fVar268 * fStack_670
        ;
        auVar100._20_4_ = auVar307._20_4_ * fStack_3ec + fVar244 * fStack_64c + fVar191 * fStack_66c
        ;
        auVar100._24_4_ = auVar307._24_4_ * fStack_3e8 + fVar190 * fStack_648 + fVar192 * fStack_668
        ;
        auVar100._28_4_ = auVar98._28_4_ + auVar98._28_4_ + auVar211._28_4_;
        auVar136._8_4_ = 0x7fffffff;
        auVar136._0_8_ = 0x7fffffff7fffffff;
        auVar136._12_4_ = 0x7fffffff;
        auVar136._16_4_ = 0x7fffffff;
        auVar136._20_4_ = 0x7fffffff;
        auVar136._24_4_ = 0x7fffffff;
        auVar136._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar100,auVar136);
        auVar137._8_4_ = 0x3e99999a;
        auVar137._0_8_ = 0x3e99999a3e99999a;
        auVar137._12_4_ = 0x3e99999a;
        auVar137._16_4_ = 0x3e99999a;
        auVar137._20_4_ = 0x3e99999a;
        auVar137._24_4_ = 0x3e99999a;
        auVar137._28_4_ = 0x3e99999a;
        auVar98 = vcmpps_avx(auVar98,auVar137,1);
        auVar184 = vorps_avx(auVar98,_local_6c0);
        auVar138._0_4_ = auVar93._0_4_ + (float)local_8a0._0_4_;
        auVar138._4_4_ = auVar93._4_4_ + (float)local_8a0._4_4_;
        auVar138._8_4_ = auVar93._8_4_ + fStack_898;
        auVar138._12_4_ = auVar93._12_4_ + fStack_894;
        auVar138._16_4_ = auVar93._16_4_ + fStack_890;
        auVar138._20_4_ = auVar93._20_4_ + fStack_88c;
        auVar138._24_4_ = auVar93._24_4_ + fStack_888;
        auVar138._28_4_ = auVar93._28_4_ + fStack_884;
        fVar220 = (ray->super_RayK<1>).tfar;
        auVar170._4_4_ = fVar220;
        auVar170._0_4_ = fVar220;
        auVar170._8_4_ = fVar220;
        auVar170._12_4_ = fVar220;
        auVar170._16_4_ = fVar220;
        auVar170._20_4_ = fVar220;
        auVar170._24_4_ = fVar220;
        auVar170._28_4_ = fVar220;
        auVar98 = vcmpps_avx(auVar138,auVar170,2);
        _local_760 = vandps_avx(auVar229,auVar98);
        auVar139._8_4_ = 3;
        auVar139._0_8_ = 0x300000003;
        auVar139._12_4_ = 3;
        auVar139._16_4_ = 3;
        auVar139._20_4_ = 3;
        auVar139._24_4_ = 3;
        auVar139._28_4_ = 3;
        auVar171._8_4_ = 2;
        auVar171._0_8_ = 0x200000002;
        auVar171._12_4_ = 2;
        auVar171._16_4_ = 2;
        auVar171._20_4_ = 2;
        auVar171._24_4_ = 2;
        auVar171._28_4_ = 2;
        auVar98 = vblendvps_avx(auVar171,auVar139,auVar184);
        auVar115 = vpcmpgtd_avx(auVar98._16_16_,local_5e0._0_16_);
        auVar83 = vpshufd_avx(local_6a0._0_16_,0);
        auVar83 = vpcmpgtd_avx(auVar98._0_16_,auVar83);
        auVar140._16_16_ = auVar115;
        auVar140._0_16_ = auVar83;
        local_780 = vblendps_avx(ZEXT1632(auVar83),auVar140,0xf0);
        local_620 = vandnps_avx(local_780,_local_760);
        auVar98 = _local_760 & ~local_780;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0x7f,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar98 >> 0xbf,0) != '\0') ||
            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar98[0x1f] < '\0') {
          local_720 = _local_480;
          local_740._4_4_ = (float)local_480._4_4_ + (float)local_8a0._4_4_;
          local_740._0_4_ = (float)local_480._0_4_ + (float)local_8a0._0_4_;
          fStack_738 = fStack_478 + fStack_898;
          fStack_734 = fStack_474 + fStack_894;
          fStack_730 = fStack_470 + fStack_890;
          fStack_72c = fStack_46c + fStack_88c;
          fStack_728 = fStack_468 + fStack_888;
          fStack_724 = fStack_464 + fStack_884;
          do {
            auVar203 = auVar262._0_16_;
            auVar141._8_4_ = 0x7f800000;
            auVar141._0_8_ = 0x7f8000007f800000;
            auVar141._12_4_ = 0x7f800000;
            auVar141._16_4_ = 0x7f800000;
            auVar141._20_4_ = 0x7f800000;
            auVar141._24_4_ = 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar141,local_720,local_620);
            auVar184 = vshufps_avx(auVar98,auVar98,0xb1);
            auVar184 = vminps_avx(auVar98,auVar184);
            auVar93 = vshufpd_avx(auVar184,auVar184,5);
            auVar184 = vminps_avx(auVar184,auVar93);
            auVar93 = vperm2f128_avx(auVar184,auVar184,1);
            auVar184 = vminps_avx(auVar184,auVar93);
            auVar184 = vcmpps_avx(auVar98,auVar184,0);
            auVar93 = local_620 & auVar184;
            auVar98 = local_620;
            if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar93 >> 0x7f,0) != '\0') ||
                  (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar93 >> 0xbf,0) != '\0') ||
                (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar93[0x1f] < '\0') {
              auVar98 = vandps_avx(auVar184,local_620);
            }
            uVar73 = vmovmskps_avx(auVar98);
            uVar69 = 0;
            if (uVar73 != 0) {
              for (; (uVar73 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
              }
            }
            uVar74 = (ulong)uVar69;
            *(undefined4 *)(local_620 + uVar74 * 4) = 0;
            aVar6 = (ray->super_RayK<1>).dir.field_0;
            _local_8c0 = (undefined1  [16])aVar6;
            auVar115 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
            local_aa0 = local_4e0[uVar74];
            auVar211 = ZEXT464((uint)local_aa0);
            auVar285 = ZEXT464(*(uint *)(local_460 + uVar74 * 4));
            if (auVar115._0_4_ < 0.0) {
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              local_ae0._0_16_ = ZEXT416(*(uint *)(local_460 + uVar74 * 4));
              fVar220 = sqrtf(auVar115._0_4_);
              auVar285 = ZEXT1664(local_ae0._0_16_);
              auVar211 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar203._8_4_ = 0x7fffffff;
              auVar203._0_8_ = 0x7fffffff7fffffff;
              auVar203._12_4_ = 0x7fffffff;
            }
            else {
              auVar115 = vsqrtss_avx(auVar115,auVar115);
              fVar220 = auVar115._0_4_;
            }
            auVar83 = vminps_avx(_local_990,_local_9b0);
            auVar115 = vmaxps_avx(_local_990,_local_9b0);
            auVar88 = vminps_avx(_local_9a0,_local_9c0);
            auVar114 = vminps_avx(auVar83,auVar88);
            auVar83 = vmaxps_avx(_local_9a0,_local_9c0);
            auVar88 = vmaxps_avx(auVar115,auVar83);
            auVar115 = vandps_avx(auVar114,auVar203);
            auVar83 = vandps_avx(auVar88,auVar203);
            auVar115 = vmaxps_avx(auVar115,auVar83);
            auVar83 = vmovshdup_avx(auVar115);
            auVar83 = vmaxss_avx(auVar83,auVar115);
            auVar115 = vshufpd_avx(auVar115,auVar115,1);
            auVar115 = vmaxss_avx(auVar115,auVar83);
            local_860._0_4_ = auVar115._0_4_ * 1.9073486e-06;
            local_880._0_4_ = fVar220 * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar88,auVar88,0xff);
            lVar72 = 4;
            do {
              local_aa0 = auVar211._0_4_;
              local_9e0._0_4_ = 1.0 - local_aa0;
              auVar115 = vshufps_avx(auVar211._0_16_,auVar211._0_16_,0);
              fVar220 = auVar115._0_4_;
              fVar174 = auVar115._4_4_;
              fVar240 = auVar115._8_4_;
              fVar188 = auVar115._12_4_;
              auVar115 = vshufps_avx(ZEXT416((uint)local_9e0._0_4_),ZEXT416((uint)local_9e0._0_4_),0
                                    );
              fVar242 = auVar115._0_4_;
              fVar189 = auVar115._4_4_;
              fVar244 = auVar115._8_4_;
              fVar190 = auVar115._12_4_;
              fVar249 = (float)local_9a0._0_4_ * fVar220 + (float)local_9b0._0_4_ * fVar242;
              fVar263 = (float)local_9a0._4_4_ * fVar174 + (float)local_9b0._4_4_ * fVar189;
              fVar265 = fStack_998 * fVar240 + fStack_9a8 * fVar244;
              fVar268 = fStack_994 * fVar188 + fStack_9a4 * fVar190;
              auVar226._0_4_ =
                   fVar242 * ((float)local_9b0._0_4_ * fVar220 + fVar242 * (float)local_990._0_4_) +
                   fVar220 * fVar249;
              auVar226._4_4_ =
                   fVar189 * ((float)local_9b0._4_4_ * fVar174 + fVar189 * (float)local_990._4_4_) +
                   fVar174 * fVar263;
              auVar226._8_4_ =
                   fVar244 * (fStack_9a8 * fVar240 + fVar244 * fStack_988) + fVar240 * fVar265;
              auVar226._12_4_ =
                   fVar190 * (fStack_9a4 * fVar188 + fVar190 * fStack_984) + fVar188 * fVar268;
              auVar180._0_4_ =
                   fVar242 * fVar249 +
                   fVar220 * (fVar220 * (float)local_9c0._0_4_ + (float)local_9a0._0_4_ * fVar242);
              auVar180._4_4_ =
                   fVar189 * fVar263 +
                   fVar174 * (fVar174 * (float)local_9c0._4_4_ + (float)local_9a0._4_4_ * fVar189);
              auVar180._8_4_ =
                   fVar244 * fVar265 + fVar240 * (fVar240 * fStack_9b8 + fStack_998 * fVar244);
              auVar180._12_4_ =
                   fVar190 * fVar268 + fVar188 * (fVar188 * fStack_9b4 + fStack_994 * fVar190);
              auVar83 = auVar285._0_16_;
              auVar115 = vshufps_avx(auVar83,auVar83,0);
              auVar118._0_4_ = auVar115._0_4_ * (float)local_8c0._0_4_ + 0.0;
              auVar118._4_4_ = auVar115._4_4_ * (float)local_8c0._4_4_ + 0.0;
              auVar118._8_4_ = auVar115._8_4_ * fStack_8b8 + 0.0;
              auVar118._12_4_ = auVar115._12_4_ * fStack_8b4 + 0.0;
              auVar87._0_4_ = fVar242 * auVar226._0_4_ + fVar220 * auVar180._0_4_;
              auVar87._4_4_ = fVar189 * auVar226._4_4_ + fVar174 * auVar180._4_4_;
              auVar87._8_4_ = fVar244 * auVar226._8_4_ + fVar240 * auVar180._8_4_;
              auVar87._12_4_ = fVar190 * auVar226._12_4_ + fVar188 * auVar180._12_4_;
              local_6e0._0_16_ = auVar87;
              auVar115 = vsubps_avx(auVar118,auVar87);
              _local_980 = auVar115;
              auVar115 = vdpps_avx(auVar115,auVar115,0x7f);
              fStack_a9c = auVar211._4_4_;
              fStack_a98 = auVar211._8_4_;
              fStack_a94 = auVar211._12_4_;
              local_ae0._0_16_ = auVar83;
              local_a80._0_16_ = auVar115;
              if (auVar115._0_4_ < 0.0) {
                local_9e0._0_16_ = ZEXT416((uint)local_9e0._0_4_);
                local_940._0_16_ = auVar226;
                local_960._0_16_ = auVar180;
                fVar220 = sqrtf(auVar115._0_4_);
                auVar211 = ZEXT1664(CONCAT412(fStack_a94,
                                              CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
                auVar180 = local_960._0_16_;
                auVar226 = local_940._0_16_;
                auVar83 = local_ae0._0_16_;
              }
              else {
                auVar115 = vsqrtss_avx(auVar115,auVar115);
                fVar220 = auVar115._0_4_;
              }
              auVar115 = vsubps_avx(auVar180,auVar226);
              auVar254._0_4_ = auVar115._0_4_ * 3.0;
              auVar254._4_4_ = auVar115._4_4_ * 3.0;
              auVar254._8_4_ = auVar115._8_4_ * 3.0;
              auVar254._12_4_ = auVar115._12_4_ * 3.0;
              fVar174 = auVar211._0_4_;
              auVar115 = vshufps_avx(ZEXT416((uint)(fVar174 * 6.0)),ZEXT416((uint)(fVar174 * 6.0)),0
                                    );
              auVar88 = ZEXT416((uint)(((float)local_9e0._0_4_ - (fVar174 + fVar174)) * 6.0));
              auVar114 = vshufps_avx(auVar88,auVar88,0);
              auVar88 = ZEXT416((uint)((fVar174 - ((float)local_9e0._0_4_ + (float)local_9e0._0_4_))
                                      * 6.0));
              auVar12 = vshufps_avx(auVar88,auVar88,0);
              auVar13 = vshufps_avx(ZEXT416((uint)((float)local_9e0._0_4_ * 6.0)),
                                    ZEXT416((uint)((float)local_9e0._0_4_ * 6.0)),0);
              auVar88 = vdpps_avx(auVar254,auVar254,0x7f);
              auVar119._0_4_ =
                   auVar13._0_4_ * (float)local_990._0_4_ +
                   auVar12._0_4_ * (float)local_9b0._0_4_ +
                   auVar115._0_4_ * (float)local_9c0._0_4_ + auVar114._0_4_ * (float)local_9a0._0_4_
              ;
              auVar119._4_4_ =
                   auVar13._4_4_ * (float)local_990._4_4_ +
                   auVar12._4_4_ * (float)local_9b0._4_4_ +
                   auVar115._4_4_ * (float)local_9c0._4_4_ + auVar114._4_4_ * (float)local_9a0._4_4_
              ;
              auVar119._8_4_ =
                   auVar13._8_4_ * fStack_988 +
                   auVar12._8_4_ * fStack_9a8 +
                   auVar115._8_4_ * fStack_9b8 + auVar114._8_4_ * fStack_998;
              auVar119._12_4_ =
                   auVar13._12_4_ * fStack_984 +
                   auVar12._12_4_ * fStack_9a4 +
                   auVar115._12_4_ * fStack_9b4 + auVar114._12_4_ * fStack_994;
              auVar115 = vblendps_avx(auVar88,_DAT_01feba10,0xe);
              auVar114 = vrsqrtss_avx(auVar115,auVar115);
              fVar240 = auVar114._0_4_;
              fVar174 = auVar88._0_4_;
              auVar114 = vdpps_avx(auVar254,auVar119,0x7f);
              auVar12 = vshufps_avx(auVar88,auVar88,0);
              auVar120._0_4_ = auVar119._0_4_ * auVar12._0_4_;
              auVar120._4_4_ = auVar119._4_4_ * auVar12._4_4_;
              auVar120._8_4_ = auVar119._8_4_ * auVar12._8_4_;
              auVar120._12_4_ = auVar119._12_4_ * auVar12._12_4_;
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar204._0_4_ = auVar254._0_4_ * auVar114._0_4_;
              auVar204._4_4_ = auVar254._4_4_ * auVar114._4_4_;
              auVar204._8_4_ = auVar254._8_4_ * auVar114._8_4_;
              auVar204._12_4_ = auVar254._12_4_ * auVar114._12_4_;
              auVar12 = vsubps_avx(auVar120,auVar204);
              auVar114 = vrcpss_avx(auVar115,auVar115);
              auVar115 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                    ZEXT416((uint)(auVar83._0_4_ * (float)local_880._0_4_)));
              auVar83 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar174 * auVar114._0_4_)));
              auVar83 = vshufps_avx(auVar83,auVar83,0);
              uVar74 = CONCAT44(auVar254._4_4_,auVar254._0_4_);
              auVar227._0_8_ = uVar74 ^ 0x8000000080000000;
              auVar227._8_4_ = -auVar254._8_4_;
              auVar227._12_4_ = -auVar254._12_4_;
              auVar114 = ZEXT416((uint)(fVar240 * 1.5 + fVar174 * -0.5 * fVar240 * fVar240 * fVar240
                                       ));
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar181._0_4_ = auVar114._0_4_ * auVar12._0_4_ * auVar83._0_4_;
              auVar181._4_4_ = auVar114._4_4_ * auVar12._4_4_ * auVar83._4_4_;
              auVar181._8_4_ = auVar114._8_4_ * auVar12._8_4_ * auVar83._8_4_;
              auVar181._12_4_ = auVar114._12_4_ * auVar12._12_4_ * auVar83._12_4_;
              auVar293._0_4_ = auVar254._0_4_ * auVar114._0_4_;
              auVar293._4_4_ = auVar254._4_4_ * auVar114._4_4_;
              auVar293._8_4_ = auVar254._8_4_ * auVar114._8_4_;
              auVar293._12_4_ = auVar254._12_4_ * auVar114._12_4_;
              local_9e0._0_16_ = auVar254;
              local_940._0_4_ = auVar115._0_4_;
              if (fVar174 < 0.0) {
                local_960._0_4_ = fVar220;
                local_7e0._0_16_ = auVar293;
                _local_8e0 = auVar181;
                _local_a00 = auVar227;
                fVar240 = sqrtf(fVar174);
                auVar181 = _local_8e0;
                auVar227 = _local_a00;
                auVar293 = local_7e0._0_16_;
                fVar174 = (float)local_940._0_4_;
                fVar220 = (float)local_960._0_4_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar88,auVar88);
                fVar240 = auVar83._0_4_;
                fVar174 = auVar115._0_4_;
              }
              auVar115 = vdpps_avx(_local_980,auVar293,0x7f);
              fVar220 = ((float)local_860._0_4_ / fVar240) * (fVar220 + 1.0) +
                        fVar174 + fVar220 * (float)local_860._0_4_;
              auVar83 = vdpps_avx(auVar227,auVar293,0x7f);
              auVar88 = vdpps_avx(_local_980,auVar181,0x7f);
              auVar114 = vdpps_avx(_local_8c0,auVar293,0x7f);
              auVar12 = vdpps_avx(_local_980,auVar227,0x7f);
              fVar240 = auVar83._0_4_ + auVar88._0_4_;
              fVar188 = auVar115._0_4_;
              auVar89._0_4_ = fVar188 * fVar188;
              auVar89._4_4_ = auVar115._4_4_ * auVar115._4_4_;
              auVar89._8_4_ = auVar115._8_4_ * auVar115._8_4_;
              auVar89._12_4_ = auVar115._12_4_ * auVar115._12_4_;
              auVar88 = vsubps_avx(local_a80._0_16_,auVar89);
              auVar83 = vdpps_avx(_local_980,_local_8c0,0x7f);
              fVar242 = auVar12._0_4_ - fVar188 * fVar240;
              fVar189 = auVar83._0_4_ - fVar188 * auVar114._0_4_;
              auVar83 = vrsqrtss_avx(auVar88,auVar88);
              fVar244 = auVar88._0_4_;
              fVar188 = auVar83._0_4_;
              fVar188 = fVar188 * 1.5 + fVar244 * -0.5 * fVar188 * fVar188 * fVar188;
              if (fVar244 < 0.0) {
                local_960._0_16_ = auVar115;
                local_a00._0_4_ = fVar220;
                local_7e0._0_16_ = ZEXT416((uint)fVar240);
                _local_8e0 = auVar114;
                local_820._0_4_ = fVar242;
                local_840._0_4_ = fVar189;
                local_800._0_4_ = fVar188;
                fVar244 = sqrtf(fVar244);
                fVar220 = (float)local_a00._0_4_;
                fVar188 = (float)local_800._0_4_;
                fVar242 = (float)local_820._0_4_;
                fVar189 = (float)local_840._0_4_;
                auVar114 = _local_8e0;
                auVar115 = local_960._0_16_;
                auVar83 = local_7e0._0_16_;
                fVar174 = (float)local_940._0_4_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar88,auVar88);
                fVar244 = auVar83._0_4_;
                auVar83 = ZEXT416((uint)fVar240);
              }
              auVar307 = ZEXT1664(local_9e0._0_16_);
              auVar78 = vpermilps_avx(local_6e0._0_16_,0xff);
              auVar13 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xff);
              fVar240 = fVar242 * fVar188 - auVar13._0_4_;
              auVar205._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar205._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar205._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar228._0_4_ = -fVar240;
              auVar228._4_4_ = 0x80000000;
              auVar228._8_4_ = 0x80000000;
              auVar228._12_4_ = 0x80000000;
              auVar88 = vinsertps_avx(ZEXT416((uint)(fVar189 * fVar188)),auVar205,0x10);
              auVar12 = vmovsldup_avx(ZEXT416((uint)(auVar83._0_4_ * fVar189 * fVar188 -
                                                    auVar114._0_4_ * fVar240)));
              auVar88 = vdivps_avx(auVar88,auVar12);
              auVar78 = ZEXT416((uint)(fVar244 - auVar78._0_4_));
              auVar114 = vinsertps_avx(auVar115,auVar78,0x10);
              auVar182._0_4_ = auVar114._0_4_ * auVar88._0_4_;
              auVar182._4_4_ = auVar114._4_4_ * auVar88._4_4_;
              auVar182._8_4_ = auVar114._8_4_ * auVar88._8_4_;
              auVar182._12_4_ = auVar114._12_4_ * auVar88._12_4_;
              auVar83 = vinsertps_avx(auVar228,auVar83,0x1c);
              auVar83 = vdivps_avx(auVar83,auVar12);
              auVar164._0_4_ = auVar114._0_4_ * auVar83._0_4_;
              auVar164._4_4_ = auVar114._4_4_ * auVar83._4_4_;
              auVar164._8_4_ = auVar114._8_4_ * auVar83._8_4_;
              auVar164._12_4_ = auVar114._12_4_ * auVar83._12_4_;
              auVar83 = vhaddps_avx(auVar182,auVar182);
              auVar88 = vhaddps_avx(auVar164,auVar164);
              local_aa0 = local_aa0 - auVar83._0_4_;
              auVar211 = ZEXT464((uint)local_aa0);
              fVar240 = (float)local_ae0._0_4_ - auVar88._0_4_;
              auVar285 = ZEXT464((uint)fVar240);
              auVar206._8_4_ = 0x7fffffff;
              auVar206._0_8_ = 0x7fffffff7fffffff;
              auVar206._12_4_ = 0x7fffffff;
              auVar262 = ZEXT1664(auVar206);
              auVar115 = vandps_avx(auVar115,auVar206);
              if (fVar220 <= auVar115._0_4_) {
LAB_00f19bd3:
                bVar45 = false;
              }
              else {
                auVar115 = vandps_avx(auVar78,auVar206);
                if ((float)local_700._0_4_ * 1.9073486e-06 + fVar174 + fVar220 <= auVar115._0_4_)
                goto LAB_00f19bd3;
                fVar240 = fVar240 + (float)local_7c0._0_4_;
                auVar285 = ZEXT464((uint)fVar240);
                bVar45 = true;
                if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar240) &&
                     (fVar220 = (ray->super_RayK<1>).tfar, fVar240 <= fVar220)) &&
                    (0.0 <= local_aa0)) && (local_aa0 <= 1.0)) {
                  auVar115 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                  fVar174 = auVar115._0_4_;
                  pGVar8 = (context->scene->geometries).items[local_aa8].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar115 = ZEXT416((uint)(fVar174 * 1.5 +
                                             local_a80._0_4_ * -0.5 * fVar174 * fVar174 * fVar174));
                    auVar115 = vshufps_avx(auVar115,auVar115,0);
                    auVar121._0_4_ = auVar115._0_4_ * (float)local_980._0_4_;
                    auVar121._4_4_ = auVar115._4_4_ * (float)local_980._4_4_;
                    auVar121._8_4_ = auVar115._8_4_ * fStack_978;
                    auVar121._12_4_ = auVar115._12_4_ * fStack_974;
                    auVar90._0_4_ = local_9e0._0_4_ + auVar13._0_4_ * auVar121._0_4_;
                    auVar90._4_4_ = local_9e0._4_4_ + auVar13._4_4_ * auVar121._4_4_;
                    auVar90._8_4_ = local_9e0._8_4_ + auVar13._8_4_ * auVar121._8_4_;
                    auVar90._12_4_ = local_9e0._12_4_ + auVar13._12_4_ * auVar121._12_4_;
                    auVar115 = vshufps_avx(auVar121,auVar121,0xc9);
                    auVar83 = vshufps_avx(local_9e0._0_16_,local_9e0._0_16_,0xc9);
                    auVar122._0_4_ = auVar83._0_4_ * auVar121._0_4_;
                    auVar122._4_4_ = auVar83._4_4_ * auVar121._4_4_;
                    auVar122._8_4_ = auVar83._8_4_ * auVar121._8_4_;
                    auVar122._12_4_ = auVar83._12_4_ * auVar121._12_4_;
                    auVar165._0_4_ = local_9e0._0_4_ * auVar115._0_4_;
                    auVar165._4_4_ = local_9e0._4_4_ * auVar115._4_4_;
                    auVar165._8_4_ = local_9e0._8_4_ * auVar115._8_4_;
                    auVar165._12_4_ = local_9e0._12_4_ * auVar115._12_4_;
                    auVar88 = vsubps_avx(auVar165,auVar122);
                    auVar115 = vshufps_avx(auVar88,auVar88,0xc9);
                    auVar83 = vshufps_avx(auVar90,auVar90,0xc9);
                    auVar166._0_4_ = auVar83._0_4_ * auVar115._0_4_;
                    auVar166._4_4_ = auVar83._4_4_ * auVar115._4_4_;
                    auVar166._8_4_ = auVar83._8_4_ * auVar115._8_4_;
                    auVar166._12_4_ = auVar83._12_4_ * auVar115._12_4_;
                    auVar115 = vshufps_avx(auVar88,auVar88,0xd2);
                    auVar91._0_4_ = auVar90._0_4_ * auVar115._0_4_;
                    auVar91._4_4_ = auVar90._4_4_ * auVar115._4_4_;
                    auVar91._8_4_ = auVar90._8_4_ * auVar115._8_4_;
                    auVar91._12_4_ = auVar90._12_4_ * auVar115._12_4_;
                    auVar115 = vsubps_avx(auVar166,auVar91);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar240;
                      auVar83 = vshufps_avx(auVar115,auVar115,0xe9);
                      uVar3 = vmovlps_avx(auVar83);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar3;
                      (ray->Ng).field_0.field_0.z = auVar115._0_4_;
                      ray->u = local_aa0;
                      ray->v = 0.0;
                      ray->primID = (uint)local_a48;
                      ray->geomID = (uint)local_aa8;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      auVar83 = vshufps_avx(auVar115,auVar115,0xe9);
                      local_910 = vmovlps_avx(auVar83);
                      local_908 = auVar115._0_4_;
                      local_904 = local_aa0;
                      local_900 = 0;
                      local_8fc = (uint)local_a48;
                      local_8f8 = (uint)local_aa8;
                      local_8f4 = context->user->instID[0];
                      local_8f0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar240;
                      local_ae4 = -1;
                      local_a30.valid = &local_ae4;
                      local_a30.geometryUserPtr = pGVar8->userPtr;
                      local_a30.context = context->user;
                      local_a30.ray = (RTCRayN *)ray;
                      local_a30.hit = (RTCHitN *)&local_910;
                      local_a30.N = 1;
                      fStack_a9c = 0.0;
                      fStack_a98 = 0.0;
                      fStack_a94 = 0.0;
                      local_ae0._0_16_ = ZEXT416((uint)fVar240);
                      local_a80._0_4_ = fVar220;
                      if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f19d0e:
                        p_Var10 = context->args->filter;
                        if (p_Var10 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            auVar307 = ZEXT1664(auVar307._0_16_);
                            (*p_Var10)(&local_a30);
                            auVar285 = ZEXT1664(local_ae0._0_16_);
                            auVar211 = ZEXT1664(CONCAT412(fStack_a94,
                                                          CONCAT48(fStack_a98,
                                                                   CONCAT44(fStack_a9c,local_aa0))))
                            ;
                            auVar262 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            fVar220 = (float)local_a80._0_4_;
                          }
                          if (*local_a30.valid == 0) goto LAB_00f19dc3;
                        }
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a30.hit;
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a30.hit + 4);
                        (((Vec3f *)((long)local_a30.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a30.hit + 8);
                        *(float *)((long)local_a30.ray + 0x3c) = *(float *)(local_a30.hit + 0xc);
                        *(float *)((long)local_a30.ray + 0x40) = *(float *)(local_a30.hit + 0x10);
                        *(float *)((long)local_a30.ray + 0x44) = *(float *)(local_a30.hit + 0x14);
                        *(float *)((long)local_a30.ray + 0x48) = *(float *)(local_a30.hit + 0x18);
                        *(float *)((long)local_a30.ray + 0x4c) = *(float *)(local_a30.hit + 0x1c);
                        *(float *)((long)local_a30.ray + 0x50) = *(float *)(local_a30.hit + 0x20);
                      }
                      else {
                        auVar307 = ZEXT1664(local_9e0._0_16_);
                        (*pGVar8->intersectionFilterN)(&local_a30);
                        auVar285 = ZEXT1664(local_ae0._0_16_);
                        auVar211 = ZEXT1664(CONCAT412(fStack_a94,
                                                      CONCAT48(fStack_a98,
                                                               CONCAT44(fStack_a9c,local_aa0))));
                        auVar262 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        fVar220 = (float)local_a80._0_4_;
                        if (*local_a30.valid != 0) goto LAB_00f19d0e;
LAB_00f19dc3:
                        (ray->super_RayK<1>).tfar = fVar220;
                      }
                    }
                  }
                }
              }
              auVar98 = local_620;
              bVar75 = lVar72 != 0;
              lVar72 = lVar72 + -1;
            } while ((!bVar45) && (bVar75));
            fVar220 = (ray->super_RayK<1>).tfar;
            auVar101._4_4_ = fVar220;
            auVar101._0_4_ = fVar220;
            auVar101._8_4_ = fVar220;
            auVar101._12_4_ = fVar220;
            auVar101._16_4_ = fVar220;
            auVar101._20_4_ = fVar220;
            auVar101._24_4_ = fVar220;
            auVar101._28_4_ = fVar220;
            auVar184 = vcmpps_avx(_local_740,auVar101,2);
            local_620 = vandps_avx(auVar184,local_620);
            auVar98 = auVar98 & auVar184;
            uVar74 = local_640._0_8_;
          } while ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar98 >> 0x7f,0) != '\0') ||
                     (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar98 >> 0xbf,0) != '\0') ||
                   (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar98[0x1f] < '\0');
        }
        auVar98 = vandps_avx(local_5c0,local_5a0);
        auVar184 = vandps_avx(local_780,_local_760);
        auVar262 = ZEXT3264(_local_8a0);
        auVar172._0_4_ = local_8a0._0_4_ + local_440._0_4_;
        auVar172._4_4_ = local_8a0._4_4_ + local_440._4_4_;
        auVar172._8_4_ = local_8a0._8_4_ + local_440._8_4_;
        auVar172._12_4_ = local_8a0._12_4_ + local_440._12_4_;
        auVar172._16_4_ = local_8a0._16_4_ + local_440._16_4_;
        auVar172._20_4_ = local_8a0._20_4_ + local_440._20_4_;
        auVar172._24_4_ = local_8a0._24_4_ + local_440._24_4_;
        auVar172._28_4_ = local_8a0._28_4_ + local_440._28_4_;
        fVar220 = (ray->super_RayK<1>).tfar;
        auVar210._4_4_ = fVar220;
        auVar210._0_4_ = fVar220;
        auVar210._8_4_ = fVar220;
        auVar210._12_4_ = fVar220;
        auVar210._16_4_ = fVar220;
        auVar210._20_4_ = fVar220;
        auVar210._24_4_ = fVar220;
        auVar210._28_4_ = fVar220;
        auVar93 = vcmpps_avx(auVar172,auVar210,2);
        auVar98 = vandps_avx(auVar93,auVar98);
        auVar238._0_4_ = local_8a0._0_4_ + local_480._0_4_;
        auVar238._4_4_ = local_8a0._4_4_ + local_480._4_4_;
        auVar238._8_4_ = local_8a0._8_4_ + local_480._8_4_;
        auVar238._12_4_ = local_8a0._12_4_ + local_480._12_4_;
        auVar238._16_4_ = local_8a0._16_4_ + local_480._16_4_;
        auVar238._20_4_ = local_8a0._20_4_ + local_480._20_4_;
        auVar238._24_4_ = local_8a0._24_4_ + local_480._24_4_;
        auVar238._28_4_ = local_8a0._28_4_ + local_480._28_4_;
        auVar93 = vcmpps_avx(auVar238,auVar210,2);
        auVar184 = vandps_avx(auVar93,auVar184);
        auVar184 = vorps_avx(auVar98,auVar184);
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0x7f,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar184 >> 0xbf,0) != '\0') ||
            (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar184[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar70 * 0x60) = auVar184;
          auVar98 = vblendvps_avx(_local_480,local_440,auVar98);
          *(undefined1 (*) [32])(auStack_160 + uVar70 * 0x60) = auVar98;
          uVar3 = vmovlps_avx(local_a40);
          *(undefined8 *)(afStack_140 + uVar70 * 0x18) = uVar3;
          auStack_138[uVar70 * 0x18] = (int)uVar74 + 1;
          uVar70 = (ulong)((int)uVar70 + 1);
          goto LAB_00f18842;
        }
        auVar229._8_4_ = 0x3f800000;
        auVar229._0_8_ = &DAT_3f8000003f800000;
        auVar229._12_4_ = 0x3f800000;
        auVar229._16_4_ = 0x3f800000;
        auVar229._20_4_ = 0x3f800000;
        auVar229._24_4_ = 0x3f800000;
        auVar229._28_4_ = 0x3f800000;
      }
    }
    auVar285 = ZEXT1664(local_a40);
    fVar220 = (ray->super_RayK<1>).tfar;
    auVar96._4_4_ = fVar220;
    auVar96._0_4_ = fVar220;
    auVar96._8_4_ = fVar220;
    auVar96._12_4_ = fVar220;
    auVar96._16_4_ = fVar220;
    auVar96._20_4_ = fVar220;
    auVar96._24_4_ = fVar220;
    auVar96._28_4_ = fVar220;
    do {
      if ((int)uVar70 == 0) {
        fVar220 = (ray->super_RayK<1>).tfar;
        auVar92._4_4_ = fVar220;
        auVar92._0_4_ = fVar220;
        auVar92._8_4_ = fVar220;
        auVar92._12_4_ = fVar220;
        auVar115 = vcmpps_avx(local_490,auVar92,2);
        uVar69 = vmovmskps_avx(auVar115);
        uVar69 = (uint)local_7a8 - 1 & (uint)local_7a8 & uVar69;
        if (uVar69 == 0) {
          return;
        }
        goto LAB_00f176cc;
      }
      uVar71 = (ulong)((int)uVar70 - 1);
      lVar72 = uVar71 * 0x60;
      auVar184 = *(undefined1 (*) [32])(auStack_180 + lVar72);
      auVar98 = *(undefined1 (*) [32])(auStack_160 + lVar72);
      auVar127._0_4_ = auVar262._0_4_ + auVar98._0_4_;
      auVar127._4_4_ = auVar262._4_4_ + auVar98._4_4_;
      auVar127._8_4_ = auVar262._8_4_ + auVar98._8_4_;
      auVar127._12_4_ = auVar262._12_4_ + auVar98._12_4_;
      auVar127._16_4_ = auVar262._16_4_ + auVar98._16_4_;
      auVar127._20_4_ = auVar262._20_4_ + auVar98._20_4_;
      auVar127._24_4_ = auVar262._24_4_ + auVar98._24_4_;
      auVar127._28_4_ = auVar262._28_4_ + auVar98._28_4_;
      auVar168 = vcmpps_avx(auVar127,auVar96,2);
      auVar93 = vandps_avx(auVar168,auVar184);
      local_440 = auVar93;
      auVar14 = auVar184 & auVar168;
      bVar63 = (auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar64 = (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar61 = SUB321(auVar14 >> 0x7f,0) == '\0';
      bVar60 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar59 = SUB321(auVar14 >> 0xbf,0) == '\0';
      bVar75 = (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar45 = -1 < auVar14[0x1f];
      if (((((((!bVar63 || !bVar64) || !bVar62) || !bVar61) || !bVar60) || !bVar59) || !bVar75) ||
          !bVar45) {
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar98 = vblendvps_avx(auVar186,auVar98,auVar93);
        auVar184 = vshufps_avx(auVar98,auVar98,0xb1);
        auVar184 = vminps_avx(auVar98,auVar184);
        auVar168 = vshufpd_avx(auVar184,auVar184,5);
        auVar184 = vminps_avx(auVar184,auVar168);
        auVar168 = vperm2f128_avx(auVar184,auVar184,1);
        auVar184 = vminps_avx(auVar184,auVar168);
        auVar98 = vcmpps_avx(auVar98,auVar184,0);
        auVar184 = auVar93 & auVar98;
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0x7f,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar184 >> 0xbf,0) != '\0') ||
            (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar184[0x1f] < '\0') {
          auVar93 = vandps_avx(auVar98,auVar93);
        }
        fVar220 = afStack_140[uVar71 * 0x18 + 1];
        uVar74 = (ulong)auStack_138[uVar71 * 0x18];
        uVar73 = vmovmskps_avx(auVar93);
        uVar69 = 0;
        if (uVar73 != 0) {
          for (; (uVar73 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
          }
        }
        fVar174 = afStack_140[uVar71 * 0x18];
        *(undefined4 *)(local_440 + (ulong)uVar69 * 4) = 0;
        if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_440 >> 0x7f,0) != '\0') ||
              (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_440 >> 0xbf,0) != '\0') ||
            (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_440[0x1f] < '\0') {
          uVar71 = uVar70;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar72) = local_440;
        auVar115 = vshufps_avx(ZEXT416((uint)(fVar220 - fVar174)),ZEXT416((uint)(fVar220 - fVar174))
                               ,0);
        local_480._4_4_ = fVar174 + auVar115._4_4_ * 0.14285715;
        local_480._0_4_ = fVar174 + auVar115._0_4_ * 0.0;
        fStack_478 = fVar174 + auVar115._8_4_ * 0.2857143;
        fStack_474 = fVar174 + auVar115._12_4_ * 0.42857146;
        fStack_470 = fVar174 + auVar115._0_4_ * 0.5714286;
        fStack_46c = fVar174 + auVar115._4_4_ * 0.71428573;
        fStack_468 = fVar174 + auVar115._8_4_ * 0.8571429;
        fStack_464 = fVar174 + auVar115._12_4_;
        auVar285 = ZEXT864(*(ulong *)(local_480 + (ulong)uVar69 * 4));
        auVar184 = local_440;
      }
      uVar70 = uVar71;
      auVar211 = ZEXT3264(auVar168);
    } while (((((((bVar63 && bVar64) && bVar62) && bVar61) && bVar60) && bVar59) && bVar75) &&
             bVar45);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }